

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct32_sse2(__m128i *input,__m128i *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  int iVar238;
  uint uVar239;
  int iVar240;
  uint uVar241;
  int iVar242;
  uint uVar243;
  int iVar244;
  uint uVar245;
  int iVar246;
  uint uVar247;
  int iVar248;
  uint uVar249;
  int iVar250;
  uint uVar251;
  int iVar252;
  uint uVar253;
  int iVar254;
  uint uVar255;
  int iVar256;
  uint uVar257;
  int iVar258;
  uint uVar259;
  int iVar260;
  uint uVar261;
  int iVar262;
  uint uVar263;
  int iVar264;
  uint uVar265;
  undefined4 uVar266;
  int iVar267;
  int iVar268;
  uint uVar269;
  int32_t *piVar270;
  undefined8 *in_RDI;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i d1_15;
  __m128i d0_15;
  __m128i c1_15;
  __m128i c0_15;
  __m128i b1_15;
  __m128i b0_15;
  __m128i a1_15;
  __m128i a0_15;
  __m128i v1_15;
  __m128i v0_15;
  __m128i u1_15;
  __m128i u0_15;
  __m128i t1_15;
  __m128i t0_15;
  __m128i d1_14;
  __m128i d0_14;
  __m128i c1_14;
  __m128i c0_14;
  __m128i b1_14;
  __m128i b0_14;
  __m128i a1_14;
  __m128i a0_14;
  __m128i v1_14;
  __m128i v0_14;
  __m128i u1_14;
  __m128i u0_14;
  __m128i t1_14;
  __m128i t0_14;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i d1_13;
  __m128i d0_13;
  __m128i c1_13;
  __m128i c0_13;
  __m128i b1_13;
  __m128i b0_13;
  __m128i a1_13;
  __m128i a0_13;
  __m128i v1_13;
  __m128i v0_13;
  __m128i u1_13;
  __m128i u0_13;
  __m128i t1_13;
  __m128i t0_13;
  __m128i d1_12;
  __m128i d0_12;
  __m128i c1_12;
  __m128i c0_12;
  __m128i b1_12;
  __m128i b0_12;
  __m128i a1_12;
  __m128i a0_12;
  __m128i v1_12;
  __m128i v0_12;
  __m128i u1_12;
  __m128i u0_12;
  __m128i t1_12;
  __m128i t0_12;
  __m128i d1_11;
  __m128i d0_11;
  __m128i c1_11;
  __m128i c0_11;
  __m128i b1_11;
  __m128i b0_11;
  __m128i a1_11;
  __m128i a0_11;
  __m128i v1_11;
  __m128i v0_11;
  __m128i u1_11;
  __m128i u0_11;
  __m128i t1_11;
  __m128i t0_11;
  __m128i d1_10;
  __m128i d0_10;
  __m128i c1_10;
  __m128i c0_10;
  __m128i b1_10;
  __m128i b0_10;
  __m128i a1_10;
  __m128i a0_10;
  __m128i v1_10;
  __m128i v0_10;
  __m128i u1_10;
  __m128i u0_10;
  __m128i t1_10;
  __m128i t0_10;
  __m128i d1_9;
  __m128i d0_9;
  __m128i c1_9;
  __m128i c0_9;
  __m128i b1_9;
  __m128i b0_9;
  __m128i a1_9;
  __m128i a0_9;
  __m128i v1_9;
  __m128i v0_9;
  __m128i u1_9;
  __m128i u0_9;
  __m128i t1_9;
  __m128i t0_9;
  __m128i d1_8;
  __m128i d0_8;
  __m128i c1_8;
  __m128i c0_8;
  __m128i b1_8;
  __m128i b0_8;
  __m128i a1_8;
  __m128i a0_8;
  __m128i v1_8;
  __m128i v0_8;
  __m128i u1_8;
  __m128i u0_8;
  __m128i t1_8;
  __m128i t0_8;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x [32];
  __m128i cospi_p16_p48;
  __m128i cospi_p48_m16;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i cospi_p40_p24;
  __m128i cospi_p24_m40;
  __m128i cospi_p08_p56;
  __m128i cospi_p56_m08;
  __m128i cospi_p52_p12;
  __m128i cospi_p12_m52;
  __m128i cospi_p20_p44;
  __m128i cospi_p44_m20;
  __m128i cospi_p36_p28;
  __m128i cospi_p28_m36;
  __m128i cospi_p04_p60;
  __m128i cospi_p60_m04;
  __m128i cospi_p58_p06;
  __m128i cospi_p06_m58;
  __m128i cospi_p26_p38;
  __m128i cospi_p38_m26;
  __m128i cospi_p42_p22;
  __m128i cospi_p22_m42;
  __m128i cospi_p10_p54;
  __m128i cospi_p54_m10;
  __m128i cospi_p50_p14;
  __m128i cospi_p14_m50;
  __m128i cospi_p18_p46;
  __m128i cospi_p46_m18;
  __m128i cospi_p34_p30;
  __m128i cospi_p30_m34;
  __m128i cospi_p02_p62;
  __m128i cospi_p62_m02;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  undefined4 in_stack_ffffffffffffc698;
  undefined4 in_stack_ffffffffffffc69c;
  int8_t cos_bit_00;
  int8_t cos_bit_01;
  longlong lVar290;
  longlong lVar291;
  int8_t cos_bit_02;
  longlong local_2a48;
  int32_t *piStack_2a40;
  __m128i *local_2a38;
  int8_t iStack_2a21;
  longlong lStack_2a20;
  undefined2 local_2628;
  undefined2 uStack_2626;
  undefined2 uStack_2624;
  undefined2 uStack_2622;
  undefined2 local_2618;
  undefined2 uStack_2616;
  undefined2 uStack_2614;
  undefined2 uStack_2612;
  undefined2 local_2608;
  undefined2 uStack_2606;
  undefined2 uStack_2604;
  undefined2 uStack_2602;
  undefined2 local_25f8;
  undefined2 uStack_25f6;
  undefined2 uStack_25f4;
  undefined2 uStack_25f2;
  undefined2 local_25e8;
  undefined2 uStack_25e6;
  undefined2 uStack_25e4;
  undefined2 uStack_25e2;
  undefined2 local_25d8;
  undefined2 uStack_25d6;
  undefined2 uStack_25d4;
  undefined2 uStack_25d2;
  undefined2 local_25c8;
  undefined2 uStack_25c6;
  undefined2 uStack_25c4;
  undefined2 uStack_25c2;
  undefined2 local_25b8;
  undefined2 uStack_25b6;
  undefined2 uStack_25b4;
  undefined2 uStack_25b2;
  undefined2 local_25a8;
  undefined2 uStack_25a6;
  undefined2 uStack_25a4;
  undefined2 uStack_25a2;
  undefined2 local_2598;
  undefined2 uStack_2596;
  undefined2 uStack_2594;
  undefined2 uStack_2592;
  undefined2 local_2588;
  undefined2 uStack_2586;
  undefined2 uStack_2584;
  undefined2 uStack_2582;
  undefined2 local_2578;
  undefined2 uStack_2576;
  undefined2 uStack_2574;
  undefined2 uStack_2572;
  undefined2 local_2568;
  undefined2 uStack_2566;
  undefined2 uStack_2564;
  undefined2 uStack_2562;
  undefined2 local_2558;
  undefined2 uStack_2556;
  undefined2 uStack_2554;
  undefined2 uStack_2552;
  undefined2 local_2548;
  undefined2 uStack_2546;
  undefined2 uStack_2544;
  undefined2 uStack_2542;
  undefined2 local_2538;
  undefined2 uStack_2536;
  undefined2 uStack_2534;
  undefined2 uStack_2532;
  undefined2 local_2528;
  undefined2 uStack_2526;
  undefined2 uStack_2524;
  undefined2 uStack_2522;
  undefined2 local_2518;
  undefined2 uStack_2516;
  undefined2 uStack_2514;
  undefined2 uStack_2512;
  undefined2 local_2508;
  undefined2 uStack_2506;
  undefined2 uStack_2504;
  undefined2 uStack_2502;
  undefined2 local_24f8;
  undefined2 uStack_24f6;
  undefined2 uStack_24f4;
  undefined2 uStack_24f2;
  undefined2 local_24e8;
  undefined2 uStack_24e6;
  undefined2 uStack_24e4;
  undefined2 uStack_24e2;
  undefined2 local_24d8;
  undefined2 uStack_24d6;
  undefined2 uStack_24d4;
  undefined2 uStack_24d2;
  undefined2 local_24c8;
  undefined2 uStack_24c6;
  undefined2 uStack_24c4;
  undefined2 uStack_24c2;
  undefined2 local_24b8;
  undefined2 uStack_24b6;
  undefined2 uStack_24b4;
  undefined2 uStack_24b2;
  undefined2 local_24a8;
  undefined2 uStack_24a6;
  undefined2 uStack_24a4;
  undefined2 uStack_24a2;
  undefined2 local_2498;
  undefined2 uStack_2496;
  undefined2 uStack_2494;
  undefined2 uStack_2492;
  undefined2 local_2488;
  undefined2 uStack_2486;
  undefined2 uStack_2484;
  undefined2 uStack_2482;
  undefined2 local_2478;
  undefined2 uStack_2476;
  undefined2 uStack_2474;
  undefined2 uStack_2472;
  undefined2 local_2468;
  undefined2 uStack_2466;
  undefined2 uStack_2464;
  undefined2 uStack_2462;
  undefined2 local_2458;
  undefined2 uStack_2456;
  undefined2 uStack_2454;
  undefined2 uStack_2452;
  undefined2 local_2448;
  undefined2 uStack_2446;
  undefined2 uStack_2444;
  undefined2 uStack_2442;
  undefined2 local_2438;
  undefined2 uStack_2436;
  undefined2 uStack_2434;
  undefined2 uStack_2432;
  undefined2 uStack_2420;
  undefined2 uStack_241e;
  undefined2 uStack_241c;
  undefined2 uStack_241a;
  undefined2 uStack_2410;
  undefined2 uStack_240e;
  undefined2 uStack_240c;
  undefined2 uStack_240a;
  undefined2 uStack_2400;
  undefined2 uStack_23fe;
  undefined2 uStack_23fc;
  undefined2 uStack_23fa;
  undefined2 uStack_23f0;
  undefined2 uStack_23ee;
  undefined2 uStack_23ec;
  undefined2 uStack_23ea;
  undefined2 uStack_23e0;
  undefined2 uStack_23de;
  undefined2 uStack_23dc;
  undefined2 uStack_23da;
  undefined2 uStack_23d0;
  undefined2 uStack_23ce;
  undefined2 uStack_23cc;
  undefined2 uStack_23ca;
  undefined2 uStack_23c0;
  undefined2 uStack_23be;
  undefined2 uStack_23bc;
  undefined2 uStack_23ba;
  undefined2 uStack_23b0;
  undefined2 uStack_23ae;
  undefined2 uStack_23ac;
  undefined2 uStack_23aa;
  undefined2 uStack_23a0;
  undefined2 uStack_239e;
  undefined2 uStack_239c;
  undefined2 uStack_239a;
  undefined2 uStack_2390;
  undefined2 uStack_238e;
  undefined2 uStack_238c;
  undefined2 uStack_238a;
  undefined2 uStack_2380;
  undefined2 uStack_237e;
  undefined2 uStack_237c;
  undefined2 uStack_237a;
  undefined2 uStack_2370;
  undefined2 uStack_236e;
  undefined2 uStack_236c;
  undefined2 uStack_236a;
  undefined2 uStack_2360;
  undefined2 uStack_235e;
  undefined2 uStack_235c;
  undefined2 uStack_235a;
  undefined2 uStack_2350;
  undefined2 uStack_234e;
  undefined2 uStack_234c;
  undefined2 uStack_234a;
  undefined2 uStack_2340;
  undefined2 uStack_233e;
  undefined2 uStack_233c;
  undefined2 uStack_233a;
  undefined2 uStack_2330;
  undefined2 uStack_232e;
  undefined2 uStack_232c;
  undefined2 uStack_232a;
  undefined2 uStack_2320;
  undefined2 uStack_231e;
  undefined2 uStack_231c;
  undefined2 uStack_231a;
  undefined2 uStack_2310;
  undefined2 uStack_230e;
  undefined2 uStack_230c;
  undefined2 uStack_230a;
  undefined2 uStack_2300;
  undefined2 uStack_22fe;
  undefined2 uStack_22fc;
  undefined2 uStack_22fa;
  undefined2 uStack_22f0;
  undefined2 uStack_22ee;
  undefined2 uStack_22ec;
  undefined2 uStack_22ea;
  undefined2 uStack_22e0;
  undefined2 uStack_22de;
  undefined2 uStack_22dc;
  undefined2 uStack_22da;
  undefined2 uStack_22d0;
  undefined2 uStack_22ce;
  undefined2 uStack_22cc;
  undefined2 uStack_22ca;
  undefined2 uStack_22c0;
  undefined2 uStack_22be;
  undefined2 uStack_22bc;
  undefined2 uStack_22ba;
  undefined2 uStack_22b0;
  undefined2 uStack_22ae;
  undefined2 uStack_22ac;
  undefined2 uStack_22aa;
  undefined2 uStack_22a0;
  undefined2 uStack_229e;
  undefined2 uStack_229c;
  undefined2 uStack_229a;
  undefined2 uStack_2290;
  undefined2 uStack_228e;
  undefined2 uStack_228c;
  undefined2 uStack_228a;
  undefined2 uStack_2280;
  undefined2 uStack_227e;
  undefined2 uStack_227c;
  undefined2 uStack_227a;
  undefined2 uStack_2270;
  undefined2 uStack_226e;
  undefined2 uStack_226c;
  undefined2 uStack_226a;
  undefined2 uStack_2260;
  undefined2 uStack_225e;
  undefined2 uStack_225c;
  undefined2 uStack_225a;
  undefined2 uStack_2250;
  undefined2 uStack_224e;
  undefined2 uStack_224c;
  undefined2 uStack_224a;
  undefined2 uStack_2240;
  undefined2 uStack_223e;
  undefined2 uStack_223c;
  undefined2 uStack_223a;
  undefined2 uStack_2230;
  undefined2 uStack_222e;
  undefined2 uStack_222c;
  undefined2 uStack_222a;
  int local_1a18;
  int iStack_1a14;
  int iStack_1a10;
  int iStack_1a0c;
  int local_19f8;
  int iStack_19f4;
  int iStack_19f0;
  int iStack_19ec;
  int local_19d8;
  int iStack_19d4;
  int iStack_19d0;
  int iStack_19cc;
  int local_19b8;
  int iStack_19b4;
  int iStack_19b0;
  int iStack_19ac;
  int local_1998;
  int iStack_1994;
  int iStack_1990;
  int iStack_198c;
  int local_1978;
  int iStack_1974;
  int iStack_1970;
  int iStack_196c;
  int local_1958;
  int iStack_1954;
  int iStack_1950;
  int iStack_194c;
  int local_1938;
  int iStack_1934;
  int iStack_1930;
  int iStack_192c;
  int local_1918;
  int iStack_1914;
  int iStack_1910;
  int iStack_190c;
  int local_18f8;
  int iStack_18f4;
  int iStack_18f0;
  int iStack_18ec;
  int local_18d8;
  int iStack_18d4;
  int iStack_18d0;
  int iStack_18cc;
  int local_18b8;
  int iStack_18b4;
  int iStack_18b0;
  int iStack_18ac;
  int local_1898;
  int iStack_1894;
  int iStack_1890;
  int iStack_188c;
  int local_1878;
  int iStack_1874;
  int iStack_1870;
  int iStack_186c;
  int local_1858;
  int iStack_1854;
  int iStack_1850;
  int iStack_184c;
  int local_1838;
  int iStack_1834;
  int iStack_1830;
  int iStack_182c;
  int local_1818;
  int iStack_1814;
  int iStack_1810;
  int iStack_180c;
  int local_17f8;
  int iStack_17f4;
  int iStack_17f0;
  int iStack_17ec;
  int local_17d8;
  int iStack_17d4;
  int iStack_17d0;
  int iStack_17cc;
  int local_17b8;
  int iStack_17b4;
  int iStack_17b0;
  int iStack_17ac;
  int local_1798;
  int iStack_1794;
  int iStack_1790;
  int iStack_178c;
  int local_1778;
  int iStack_1774;
  int iStack_1770;
  int iStack_176c;
  int local_1758;
  int iStack_1754;
  int iStack_1750;
  int iStack_174c;
  int local_1738;
  int iStack_1734;
  int iStack_1730;
  int iStack_172c;
  int local_1718;
  int iStack_1714;
  int iStack_1710;
  int iStack_170c;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  int local_16d8;
  int iStack_16d4;
  int iStack_16d0;
  int iStack_16cc;
  int local_16b8;
  int iStack_16b4;
  int iStack_16b0;
  int iStack_16ac;
  int local_1698;
  int iStack_1694;
  int iStack_1690;
  int iStack_168c;
  int local_1678;
  int iStack_1674;
  int iStack_1670;
  int iStack_166c;
  int local_1658;
  int iStack_1654;
  int iStack_1650;
  int iStack_164c;
  int local_1638;
  int iStack_1634;
  int iStack_1630;
  int iStack_162c;
  int local_1618;
  int iStack_1614;
  int iStack_1610;
  int iStack_160c;
  int local_15f8;
  int iStack_15f4;
  int iStack_15f0;
  int iStack_15ec;
  int local_15d8;
  int iStack_15d4;
  int iStack_15d0;
  int iStack_15cc;
  int local_15b8;
  int iStack_15b4;
  int iStack_15b0;
  int iStack_15ac;
  int local_1598;
  int iStack_1594;
  int iStack_1590;
  int iStack_158c;
  int local_1578;
  int iStack_1574;
  int iStack_1570;
  int iStack_156c;
  int local_1558;
  int iStack_1554;
  int iStack_1550;
  int iStack_154c;
  int local_1538;
  int iStack_1534;
  int iStack_1530;
  int iStack_152c;
  int local_1518;
  int iStack_1514;
  int iStack_1510;
  int iStack_150c;
  int local_14f8;
  int iStack_14f4;
  int iStack_14f0;
  int iStack_14ec;
  int local_14d8;
  int iStack_14d4;
  int iStack_14d0;
  int iStack_14cc;
  int local_14b8;
  int iStack_14b4;
  int iStack_14b0;
  int iStack_14ac;
  int local_1498;
  int iStack_1494;
  int iStack_1490;
  int iStack_148c;
  int local_1478;
  int iStack_1474;
  int iStack_1470;
  int iStack_146c;
  int local_1458;
  int iStack_1454;
  int iStack_1450;
  int iStack_144c;
  int local_1438;
  int iStack_1434;
  int iStack_1430;
  int iStack_142c;
  int local_1418;
  int iStack_1414;
  int iStack_1410;
  int iStack_140c;
  int local_13f8;
  int iStack_13f4;
  int iStack_13f0;
  int iStack_13ec;
  int local_13d8;
  int iStack_13d4;
  int iStack_13d0;
  int iStack_13cc;
  int local_13b8;
  int iStack_13b4;
  int iStack_13b0;
  int iStack_13ac;
  int local_1398;
  int iStack_1394;
  int iStack_1390;
  int iStack_138c;
  int local_1378;
  int iStack_1374;
  int iStack_1370;
  int iStack_136c;
  int local_1358;
  int iStack_1354;
  int iStack_1350;
  int iStack_134c;
  int local_1338;
  int iStack_1334;
  int iStack_1330;
  int iStack_132c;
  int local_1318;
  int iStack_1314;
  int iStack_1310;
  int iStack_130c;
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  int local_12d8;
  int iStack_12d4;
  int iStack_12d0;
  int iStack_12cc;
  int local_12b8;
  int iStack_12b4;
  int iStack_12b0;
  int iStack_12ac;
  int local_1298;
  int iStack_1294;
  int iStack_1290;
  int iStack_128c;
  int local_1278;
  int iStack_1274;
  int iStack_1270;
  int iStack_126c;
  int local_1258;
  int iStack_1254;
  int iStack_1250;
  int iStack_124c;
  int local_1238;
  int iStack_1234;
  int iStack_1230;
  int iStack_122c;
  
  piVar270 = cospi_arr(0xc);
  iVar238 = (uint)*(ushort *)(piVar270 + 0x3e) + piVar270[2] * -0x10000;
  uVar239 = (uint)*(ushort *)(piVar270 + 2) | piVar270[0x3e] << 0x10;
  iVar240 = (uint)*(ushort *)(piVar270 + 0x1e) + piVar270[0x22] * -0x10000;
  uVar241 = (uint)*(ushort *)(piVar270 + 0x22) | piVar270[0x1e] << 0x10;
  iVar242 = (uint)*(ushort *)(piVar270 + 0x2e) + piVar270[0x12] * -0x10000;
  uVar243 = (uint)*(ushort *)(piVar270 + 0x12) | piVar270[0x2e] << 0x10;
  iVar244 = (uint)*(ushort *)(piVar270 + 0xe) + piVar270[0x32] * -0x10000;
  uVar245 = (uint)*(ushort *)(piVar270 + 0x32) | piVar270[0xe] << 0x10;
  iVar246 = (uint)*(ushort *)(piVar270 + 0x36) + piVar270[10] * -0x10000;
  uVar247 = (uint)*(ushort *)(piVar270 + 10) | piVar270[0x36] << 0x10;
  iVar248 = (uint)*(ushort *)(piVar270 + 0x16) + piVar270[0x2a] * -0x10000;
  uVar249 = (uint)*(ushort *)(piVar270 + 0x2a) | piVar270[0x16] << 0x10;
  iVar250 = (uint)*(ushort *)(piVar270 + 0x26) + piVar270[0x1a] * -0x10000;
  uVar251 = (uint)*(ushort *)(piVar270 + 0x1a) | piVar270[0x26] << 0x10;
  iVar252 = (uint)*(ushort *)(piVar270 + 6) + piVar270[0x3a] * -0x10000;
  uVar253 = (uint)*(ushort *)(piVar270 + 0x3a) | piVar270[6] << 0x10;
  iVar254 = (uint)*(ushort *)(piVar270 + 0x3c) + piVar270[4] * -0x10000;
  uVar255 = (uint)*(ushort *)(piVar270 + 4) | piVar270[0x3c] << 0x10;
  iVar256 = (uint)*(ushort *)(piVar270 + 0x1c) + piVar270[0x24] * -0x10000;
  uVar257 = (uint)*(ushort *)(piVar270 + 0x24) | piVar270[0x1c] << 0x10;
  iVar258 = (uint)*(ushort *)(piVar270 + 0x2c) + piVar270[0x14] * -0x10000;
  uVar259 = (uint)*(ushort *)(piVar270 + 0x14) | piVar270[0x2c] << 0x10;
  iVar260 = (uint)*(ushort *)(piVar270 + 0xc) + piVar270[0x34] * -0x10000;
  uVar261 = (uint)*(ushort *)(piVar270 + 0x34) | piVar270[0xc] << 0x10;
  iVar262 = (uint)*(ushort *)(piVar270 + 0x38) + piVar270[8] * -0x10000;
  uVar263 = (uint)*(ushort *)(piVar270 + 8) | piVar270[0x38] << 0x10;
  iVar264 = (uint)*(ushort *)(piVar270 + 0x18) + piVar270[0x28] * -0x10000;
  uVar265 = (uint)*(ushort *)(piVar270 + 0x28) | piVar270[0x18] << 0x10;
  uVar266 = CONCAT22((short)piVar270[0x20],(short)piVar270[0x20]);
  iVar267 = (piVar270[0x20] & 0xffffU) + piVar270[0x20] * -0x10000;
  iVar268 = (uint)*(ushort *)(piVar270 + 0x30) + piVar270[0x10] * -0x10000;
  uVar269 = (uint)*(ushort *)(piVar270 + 0x10) | piVar270[0x30] << 0x10;
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  uVar3 = in_RDI[0x20];
  uVar4 = in_RDI[0x21];
  uVar5 = in_RDI[0x10];
  uVar6 = in_RDI[0x11];
  uVar7 = in_RDI[0x30];
  uVar8 = in_RDI[0x31];
  uVar9 = in_RDI[8];
  uVar10 = in_RDI[9];
  uVar11 = in_RDI[0x28];
  uVar12 = in_RDI[0x29];
  uVar13 = in_RDI[0x18];
  uVar14 = in_RDI[0x19];
  uVar15 = in_RDI[0x38];
  uVar16 = in_RDI[0x39];
  uVar17 = in_RDI[4];
  uVar18 = in_RDI[5];
  uVar19 = in_RDI[0x24];
  uVar20 = in_RDI[0x25];
  uVar21 = in_RDI[0x14];
  uVar22 = in_RDI[0x15];
  uVar23 = in_RDI[0x34];
  uVar24 = in_RDI[0x35];
  uVar25 = in_RDI[0xc];
  uVar26 = in_RDI[0xd];
  uVar27 = in_RDI[0x2c];
  uVar28 = in_RDI[0x2d];
  uVar29 = in_RDI[0x1c];
  uVar30 = in_RDI[0x1d];
  uVar31 = in_RDI[0x3c];
  uVar32 = in_RDI[0x3d];
  uVar33 = in_RDI[2];
  uVar34 = in_RDI[3];
  uVar35 = in_RDI[0x22];
  uVar36 = in_RDI[0x23];
  uVar37 = in_RDI[0x12];
  uVar38 = in_RDI[0x13];
  uVar39 = in_RDI[0x32];
  uVar40 = in_RDI[0x33];
  uVar41 = in_RDI[10];
  uVar42 = in_RDI[0xb];
  uVar43 = in_RDI[0x2a];
  uVar44 = in_RDI[0x2b];
  uVar45 = in_RDI[0x1a];
  uVar46 = in_RDI[0x1b];
  uVar47 = in_RDI[0x3a];
  uVar48 = in_RDI[0x3b];
  uVar49 = in_RDI[6];
  uVar50 = in_RDI[7];
  uVar51 = in_RDI[0x26];
  uVar52 = in_RDI[0x27];
  uVar53 = in_RDI[0x16];
  uVar54 = in_RDI[0x17];
  uVar55 = in_RDI[0x36];
  uVar56 = in_RDI[0x37];
  uVar57 = in_RDI[0xe];
  uVar58 = in_RDI[0xf];
  uVar59 = in_RDI[0x2e];
  uVar60 = in_RDI[0x2f];
  uVar61 = in_RDI[0x1e];
  uVar62 = in_RDI[0x1f];
  uVar63 = in_RDI[0x3e];
  uVar64 = in_RDI[0x3f];
  local_2438 = (undefined2)uVar33;
  uStack_2436 = (undefined2)((ulong)uVar33 >> 0x10);
  uStack_2434 = (undefined2)((ulong)uVar33 >> 0x20);
  uStack_2432 = (undefined2)((ulong)uVar33 >> 0x30);
  local_2448 = (undefined2)uVar63;
  uStack_2446 = (undefined2)((ulong)uVar63 >> 0x10);
  uStack_2444 = (undefined2)((ulong)uVar63 >> 0x20);
  uStack_2442 = (undefined2)((ulong)uVar63 >> 0x30);
  uStack_2230 = (undefined2)uVar34;
  uStack_222e = (undefined2)((ulong)uVar34 >> 0x10);
  uStack_222c = (undefined2)((ulong)uVar34 >> 0x20);
  uStack_222a = (undefined2)((ulong)uVar34 >> 0x30);
  uStack_2240 = (undefined2)uVar64;
  uStack_223e = (undefined2)((ulong)uVar64 >> 0x10);
  uStack_223c = (undefined2)((ulong)uVar64 >> 0x20);
  uStack_223a = (undefined2)((ulong)uVar64 >> 0x30);
  auVar173._2_2_ = local_2448;
  auVar173._0_2_ = local_2438;
  auVar173._4_2_ = uStack_2436;
  auVar173._6_2_ = uStack_2446;
  auVar173._10_2_ = uStack_2444;
  auVar173._8_2_ = uStack_2434;
  auVar173._12_2_ = uStack_2432;
  auVar173._14_2_ = uStack_2442;
  auVar172._8_8_ = CONCAT44(iVar238,iVar238);
  auVar172._0_8_ = CONCAT44(iVar238,iVar238);
  auVar271 = pmaddwd(auVar173,auVar172);
  auVar171._2_2_ = uStack_2240;
  auVar171._0_2_ = uStack_2230;
  auVar171._4_2_ = uStack_222e;
  auVar171._6_2_ = uStack_223e;
  auVar171._10_2_ = uStack_223c;
  auVar171._8_2_ = uStack_222c;
  auVar171._12_2_ = uStack_222a;
  auVar171._14_2_ = uStack_223a;
  auVar170._8_8_ = CONCAT44(iVar238,iVar238);
  auVar170._0_8_ = CONCAT44(iVar238,iVar238);
  auVar272 = pmaddwd(auVar171,auVar170);
  auVar169._2_2_ = local_2448;
  auVar169._0_2_ = local_2438;
  auVar169._4_2_ = uStack_2436;
  auVar169._6_2_ = uStack_2446;
  auVar169._10_2_ = uStack_2444;
  auVar169._8_2_ = uStack_2434;
  auVar169._12_2_ = uStack_2432;
  auVar169._14_2_ = uStack_2442;
  auVar168._8_8_ = CONCAT44(uVar239,uVar239);
  auVar168._0_8_ = CONCAT44(uVar239,uVar239);
  auVar273 = pmaddwd(auVar169,auVar168);
  auVar167._2_2_ = uStack_2240;
  auVar167._0_2_ = uStack_2230;
  auVar167._4_2_ = uStack_222e;
  auVar167._6_2_ = uStack_223e;
  auVar167._10_2_ = uStack_223c;
  auVar167._8_2_ = uStack_222c;
  auVar167._12_2_ = uStack_222a;
  auVar167._14_2_ = uStack_223a;
  auVar166._8_8_ = CONCAT44(uVar239,uVar239);
  auVar166._0_8_ = CONCAT44(uVar239,uVar239);
  auVar274 = pmaddwd(auVar167,auVar166);
  local_1238 = auVar271._0_4_;
  iStack_1234 = auVar271._4_4_;
  iStack_1230 = auVar271._8_4_;
  iStack_122c = auVar271._12_4_;
  local_1258 = auVar272._0_4_;
  iStack_1254 = auVar272._4_4_;
  iStack_1250 = auVar272._8_4_;
  iStack_124c = auVar272._12_4_;
  local_1278 = auVar273._0_4_;
  iStack_1274 = auVar273._4_4_;
  iStack_1270 = auVar273._8_4_;
  iStack_126c = auVar273._12_4_;
  local_1298 = auVar274._0_4_;
  iStack_1294 = auVar274._4_4_;
  iStack_1290 = auVar274._8_4_;
  iStack_128c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar237._4_4_ = iStack_1234 + 0x800 >> auVar271;
  auVar237._0_4_ = local_1238 + 0x800 >> auVar271;
  auVar237._12_4_ = iStack_122c + 0x800 >> auVar271;
  auVar237._8_4_ = iStack_1230 + 0x800 >> auVar271;
  auVar236._4_4_ = iStack_1254 + 0x800 >> auVar272;
  auVar236._0_4_ = local_1258 + 0x800 >> auVar272;
  auVar236._12_4_ = iStack_124c + 0x800 >> auVar272;
  auVar236._8_4_ = iStack_1250 + 0x800 >> auVar272;
  packssdw(auVar237,auVar236);
  auVar235._4_4_ = iStack_1274 + 0x800 >> auVar273;
  auVar235._0_4_ = local_1278 + 0x800 >> auVar273;
  auVar235._12_4_ = iStack_126c + 0x800 >> auVar273;
  auVar235._8_4_ = iStack_1270 + 0x800 >> auVar273;
  auVar234._4_4_ = iStack_1294 + 0x800 >> auVar274;
  auVar234._0_4_ = local_1298 + 0x800 >> auVar274;
  auVar234._12_4_ = iStack_128c + 0x800 >> auVar274;
  auVar234._8_4_ = iStack_1290 + 0x800 >> auVar274;
  packssdw(auVar235,auVar234);
  local_2458 = (undefined2)uVar35;
  uStack_2456 = (undefined2)((ulong)uVar35 >> 0x10);
  uStack_2454 = (undefined2)((ulong)uVar35 >> 0x20);
  uStack_2452 = (undefined2)((ulong)uVar35 >> 0x30);
  local_2468 = (undefined2)uVar61;
  uStack_2466 = (undefined2)((ulong)uVar61 >> 0x10);
  uStack_2464 = (undefined2)((ulong)uVar61 >> 0x20);
  uStack_2462 = (undefined2)((ulong)uVar61 >> 0x30);
  uStack_2250 = (undefined2)uVar36;
  uStack_224e = (undefined2)((ulong)uVar36 >> 0x10);
  uStack_224c = (undefined2)((ulong)uVar36 >> 0x20);
  uStack_224a = (undefined2)((ulong)uVar36 >> 0x30);
  uStack_2260 = (undefined2)uVar62;
  uStack_225e = (undefined2)((ulong)uVar62 >> 0x10);
  uStack_225c = (undefined2)((ulong)uVar62 >> 0x20);
  uStack_225a = (undefined2)((ulong)uVar62 >> 0x30);
  auVar165._2_2_ = local_2468;
  auVar165._0_2_ = local_2458;
  auVar165._4_2_ = uStack_2456;
  auVar165._6_2_ = uStack_2466;
  auVar165._10_2_ = uStack_2464;
  auVar165._8_2_ = uStack_2454;
  auVar165._12_2_ = uStack_2452;
  auVar165._14_2_ = uStack_2462;
  auVar164._8_8_ = CONCAT44(iVar240,iVar240);
  auVar164._0_8_ = CONCAT44(iVar240,iVar240);
  auVar271 = pmaddwd(auVar165,auVar164);
  auVar163._2_2_ = uStack_2260;
  auVar163._0_2_ = uStack_2250;
  auVar163._4_2_ = uStack_224e;
  auVar163._6_2_ = uStack_225e;
  auVar163._10_2_ = uStack_225c;
  auVar163._8_2_ = uStack_224c;
  auVar163._12_2_ = uStack_224a;
  auVar163._14_2_ = uStack_225a;
  auVar162._8_8_ = CONCAT44(iVar240,iVar240);
  auVar162._0_8_ = CONCAT44(iVar240,iVar240);
  auVar272 = pmaddwd(auVar163,auVar162);
  auVar161._2_2_ = local_2468;
  auVar161._0_2_ = local_2458;
  auVar161._4_2_ = uStack_2456;
  auVar161._6_2_ = uStack_2466;
  auVar161._10_2_ = uStack_2464;
  auVar161._8_2_ = uStack_2454;
  auVar161._12_2_ = uStack_2452;
  auVar161._14_2_ = uStack_2462;
  auVar160._8_8_ = CONCAT44(uVar241,uVar241);
  auVar160._0_8_ = CONCAT44(uVar241,uVar241);
  auVar273 = pmaddwd(auVar161,auVar160);
  auVar159._2_2_ = uStack_2260;
  auVar159._0_2_ = uStack_2250;
  auVar159._4_2_ = uStack_224e;
  auVar159._6_2_ = uStack_225e;
  auVar159._10_2_ = uStack_225c;
  auVar159._8_2_ = uStack_224c;
  auVar159._12_2_ = uStack_224a;
  auVar159._14_2_ = uStack_225a;
  auVar158._8_8_ = CONCAT44(uVar241,uVar241);
  auVar158._0_8_ = CONCAT44(uVar241,uVar241);
  auVar274 = pmaddwd(auVar159,auVar158);
  local_12b8 = auVar271._0_4_;
  iStack_12b4 = auVar271._4_4_;
  iStack_12b0 = auVar271._8_4_;
  iStack_12ac = auVar271._12_4_;
  local_12d8 = auVar272._0_4_;
  iStack_12d4 = auVar272._4_4_;
  iStack_12d0 = auVar272._8_4_;
  iStack_12cc = auVar272._12_4_;
  local_12f8 = auVar273._0_4_;
  iStack_12f4 = auVar273._4_4_;
  iStack_12f0 = auVar273._8_4_;
  iStack_12ec = auVar273._12_4_;
  local_1318 = auVar274._0_4_;
  iStack_1314 = auVar274._4_4_;
  iStack_1310 = auVar274._8_4_;
  iStack_130c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar233._4_4_ = iStack_12b4 + 0x800 >> auVar271;
  auVar233._0_4_ = local_12b8 + 0x800 >> auVar271;
  auVar233._12_4_ = iStack_12ac + 0x800 >> auVar271;
  auVar233._8_4_ = iStack_12b0 + 0x800 >> auVar271;
  auVar232._4_4_ = iStack_12d4 + 0x800 >> auVar272;
  auVar232._0_4_ = local_12d8 + 0x800 >> auVar272;
  auVar232._12_4_ = iStack_12cc + 0x800 >> auVar272;
  auVar232._8_4_ = iStack_12d0 + 0x800 >> auVar272;
  packssdw(auVar233,auVar232);
  auVar231._4_4_ = iStack_12f4 + 0x800 >> auVar273;
  auVar231._0_4_ = local_12f8 + 0x800 >> auVar273;
  auVar231._12_4_ = iStack_12ec + 0x800 >> auVar273;
  auVar231._8_4_ = iStack_12f0 + 0x800 >> auVar273;
  auVar230._4_4_ = iStack_1314 + 0x800 >> auVar274;
  auVar230._0_4_ = local_1318 + 0x800 >> auVar274;
  auVar230._12_4_ = iStack_130c + 0x800 >> auVar274;
  auVar230._8_4_ = iStack_1310 + 0x800 >> auVar274;
  packssdw(auVar231,auVar230);
  local_2478 = (undefined2)uVar37;
  uStack_2476 = (undefined2)((ulong)uVar37 >> 0x10);
  uStack_2474 = (undefined2)((ulong)uVar37 >> 0x20);
  uStack_2472 = (undefined2)((ulong)uVar37 >> 0x30);
  local_2488 = (undefined2)uVar59;
  uStack_2486 = (undefined2)((ulong)uVar59 >> 0x10);
  uStack_2484 = (undefined2)((ulong)uVar59 >> 0x20);
  uStack_2482 = (undefined2)((ulong)uVar59 >> 0x30);
  uStack_2270 = (undefined2)uVar38;
  uStack_226e = (undefined2)((ulong)uVar38 >> 0x10);
  uStack_226c = (undefined2)((ulong)uVar38 >> 0x20);
  uStack_226a = (undefined2)((ulong)uVar38 >> 0x30);
  uStack_2280 = (undefined2)uVar60;
  uStack_227e = (undefined2)((ulong)uVar60 >> 0x10);
  uStack_227c = (undefined2)((ulong)uVar60 >> 0x20);
  uStack_227a = (undefined2)((ulong)uVar60 >> 0x30);
  auVar157._2_2_ = local_2488;
  auVar157._0_2_ = local_2478;
  auVar157._4_2_ = uStack_2476;
  auVar157._6_2_ = uStack_2486;
  auVar157._10_2_ = uStack_2484;
  auVar157._8_2_ = uStack_2474;
  auVar157._12_2_ = uStack_2472;
  auVar157._14_2_ = uStack_2482;
  auVar156._8_8_ = CONCAT44(iVar242,iVar242);
  auVar156._0_8_ = CONCAT44(iVar242,iVar242);
  auVar271 = pmaddwd(auVar157,auVar156);
  auVar155._2_2_ = uStack_2280;
  auVar155._0_2_ = uStack_2270;
  auVar155._4_2_ = uStack_226e;
  auVar155._6_2_ = uStack_227e;
  auVar155._10_2_ = uStack_227c;
  auVar155._8_2_ = uStack_226c;
  auVar155._12_2_ = uStack_226a;
  auVar155._14_2_ = uStack_227a;
  auVar154._8_8_ = CONCAT44(iVar242,iVar242);
  auVar154._0_8_ = CONCAT44(iVar242,iVar242);
  auVar272 = pmaddwd(auVar155,auVar154);
  auVar153._2_2_ = local_2488;
  auVar153._0_2_ = local_2478;
  auVar153._4_2_ = uStack_2476;
  auVar153._6_2_ = uStack_2486;
  auVar153._10_2_ = uStack_2484;
  auVar153._8_2_ = uStack_2474;
  auVar153._12_2_ = uStack_2472;
  auVar153._14_2_ = uStack_2482;
  auVar152._8_8_ = CONCAT44(uVar243,uVar243);
  auVar152._0_8_ = CONCAT44(uVar243,uVar243);
  auVar273 = pmaddwd(auVar153,auVar152);
  auVar151._2_2_ = uStack_2280;
  auVar151._0_2_ = uStack_2270;
  auVar151._4_2_ = uStack_226e;
  auVar151._6_2_ = uStack_227e;
  auVar151._10_2_ = uStack_227c;
  auVar151._8_2_ = uStack_226c;
  auVar151._12_2_ = uStack_226a;
  auVar151._14_2_ = uStack_227a;
  auVar150._8_8_ = CONCAT44(uVar243,uVar243);
  auVar150._0_8_ = CONCAT44(uVar243,uVar243);
  auVar274 = pmaddwd(auVar151,auVar150);
  local_1338 = auVar271._0_4_;
  iStack_1334 = auVar271._4_4_;
  iStack_1330 = auVar271._8_4_;
  iStack_132c = auVar271._12_4_;
  local_1358 = auVar272._0_4_;
  iStack_1354 = auVar272._4_4_;
  iStack_1350 = auVar272._8_4_;
  iStack_134c = auVar272._12_4_;
  local_1378 = auVar273._0_4_;
  iStack_1374 = auVar273._4_4_;
  iStack_1370 = auVar273._8_4_;
  iStack_136c = auVar273._12_4_;
  local_1398 = auVar274._0_4_;
  iStack_1394 = auVar274._4_4_;
  iStack_1390 = auVar274._8_4_;
  iStack_138c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar229._4_4_ = iStack_1334 + 0x800 >> auVar271;
  auVar229._0_4_ = local_1338 + 0x800 >> auVar271;
  auVar229._12_4_ = iStack_132c + 0x800 >> auVar271;
  auVar229._8_4_ = iStack_1330 + 0x800 >> auVar271;
  auVar228._4_4_ = iStack_1354 + 0x800 >> auVar272;
  auVar228._0_4_ = local_1358 + 0x800 >> auVar272;
  auVar228._12_4_ = iStack_134c + 0x800 >> auVar272;
  auVar228._8_4_ = iStack_1350 + 0x800 >> auVar272;
  packssdw(auVar229,auVar228);
  auVar227._4_4_ = iStack_1374 + 0x800 >> auVar273;
  auVar227._0_4_ = local_1378 + 0x800 >> auVar273;
  auVar227._12_4_ = iStack_136c + 0x800 >> auVar273;
  auVar227._8_4_ = iStack_1370 + 0x800 >> auVar273;
  auVar226._4_4_ = iStack_1394 + 0x800 >> auVar274;
  auVar226._0_4_ = local_1398 + 0x800 >> auVar274;
  auVar226._12_4_ = iStack_138c + 0x800 >> auVar274;
  auVar226._8_4_ = iStack_1390 + 0x800 >> auVar274;
  packssdw(auVar227,auVar226);
  local_2498 = (undefined2)uVar39;
  uStack_2496 = (undefined2)((ulong)uVar39 >> 0x10);
  uStack_2494 = (undefined2)((ulong)uVar39 >> 0x20);
  uStack_2492 = (undefined2)((ulong)uVar39 >> 0x30);
  local_24a8 = (undefined2)uVar57;
  uStack_24a6 = (undefined2)((ulong)uVar57 >> 0x10);
  uStack_24a4 = (undefined2)((ulong)uVar57 >> 0x20);
  uStack_24a2 = (undefined2)((ulong)uVar57 >> 0x30);
  uStack_2290 = (undefined2)uVar40;
  uStack_228e = (undefined2)((ulong)uVar40 >> 0x10);
  uStack_228c = (undefined2)((ulong)uVar40 >> 0x20);
  uStack_228a = (undefined2)((ulong)uVar40 >> 0x30);
  uStack_22a0 = (undefined2)uVar58;
  uStack_229e = (undefined2)((ulong)uVar58 >> 0x10);
  uStack_229c = (undefined2)((ulong)uVar58 >> 0x20);
  uStack_229a = (undefined2)((ulong)uVar58 >> 0x30);
  auVar149._2_2_ = local_24a8;
  auVar149._0_2_ = local_2498;
  auVar149._4_2_ = uStack_2496;
  auVar149._6_2_ = uStack_24a6;
  auVar149._10_2_ = uStack_24a4;
  auVar149._8_2_ = uStack_2494;
  auVar149._12_2_ = uStack_2492;
  auVar149._14_2_ = uStack_24a2;
  auVar148._8_8_ = CONCAT44(iVar244,iVar244);
  auVar148._0_8_ = CONCAT44(iVar244,iVar244);
  auVar271 = pmaddwd(auVar149,auVar148);
  auVar147._2_2_ = uStack_22a0;
  auVar147._0_2_ = uStack_2290;
  auVar147._4_2_ = uStack_228e;
  auVar147._6_2_ = uStack_229e;
  auVar147._10_2_ = uStack_229c;
  auVar147._8_2_ = uStack_228c;
  auVar147._12_2_ = uStack_228a;
  auVar147._14_2_ = uStack_229a;
  auVar146._8_8_ = CONCAT44(iVar244,iVar244);
  auVar146._0_8_ = CONCAT44(iVar244,iVar244);
  auVar272 = pmaddwd(auVar147,auVar146);
  auVar145._2_2_ = local_24a8;
  auVar145._0_2_ = local_2498;
  auVar145._4_2_ = uStack_2496;
  auVar145._6_2_ = uStack_24a6;
  auVar145._10_2_ = uStack_24a4;
  auVar145._8_2_ = uStack_2494;
  auVar145._12_2_ = uStack_2492;
  auVar145._14_2_ = uStack_24a2;
  auVar144._8_8_ = CONCAT44(uVar245,uVar245);
  auVar144._0_8_ = CONCAT44(uVar245,uVar245);
  auVar273 = pmaddwd(auVar145,auVar144);
  auVar143._2_2_ = uStack_22a0;
  auVar143._0_2_ = uStack_2290;
  auVar143._4_2_ = uStack_228e;
  auVar143._6_2_ = uStack_229e;
  auVar143._10_2_ = uStack_229c;
  auVar143._8_2_ = uStack_228c;
  auVar143._12_2_ = uStack_228a;
  auVar143._14_2_ = uStack_229a;
  auVar142._8_8_ = CONCAT44(uVar245,uVar245);
  auVar142._0_8_ = CONCAT44(uVar245,uVar245);
  auVar274 = pmaddwd(auVar143,auVar142);
  local_13b8 = auVar271._0_4_;
  iStack_13b4 = auVar271._4_4_;
  iStack_13b0 = auVar271._8_4_;
  iStack_13ac = auVar271._12_4_;
  local_13d8 = auVar272._0_4_;
  iStack_13d4 = auVar272._4_4_;
  iStack_13d0 = auVar272._8_4_;
  iStack_13cc = auVar272._12_4_;
  local_13f8 = auVar273._0_4_;
  iStack_13f4 = auVar273._4_4_;
  iStack_13f0 = auVar273._8_4_;
  iStack_13ec = auVar273._12_4_;
  local_1418 = auVar274._0_4_;
  iStack_1414 = auVar274._4_4_;
  iStack_1410 = auVar274._8_4_;
  iStack_140c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar225._4_4_ = iStack_13b4 + 0x800 >> auVar271;
  auVar225._0_4_ = local_13b8 + 0x800 >> auVar271;
  auVar225._12_4_ = iStack_13ac + 0x800 >> auVar271;
  auVar225._8_4_ = iStack_13b0 + 0x800 >> auVar271;
  auVar224._4_4_ = iStack_13d4 + 0x800 >> auVar272;
  auVar224._0_4_ = local_13d8 + 0x800 >> auVar272;
  auVar224._12_4_ = iStack_13cc + 0x800 >> auVar272;
  auVar224._8_4_ = iStack_13d0 + 0x800 >> auVar272;
  packssdw(auVar225,auVar224);
  auVar223._4_4_ = iStack_13f4 + 0x800 >> auVar273;
  auVar223._0_4_ = local_13f8 + 0x800 >> auVar273;
  auVar223._12_4_ = iStack_13ec + 0x800 >> auVar273;
  auVar223._8_4_ = iStack_13f0 + 0x800 >> auVar273;
  auVar222._4_4_ = iStack_1414 + 0x800 >> auVar274;
  auVar222._0_4_ = local_1418 + 0x800 >> auVar274;
  auVar222._12_4_ = iStack_140c + 0x800 >> auVar274;
  auVar222._8_4_ = iStack_1410 + 0x800 >> auVar274;
  packssdw(auVar223,auVar222);
  local_24b8 = (undefined2)uVar41;
  uStack_24b6 = (undefined2)((ulong)uVar41 >> 0x10);
  uStack_24b4 = (undefined2)((ulong)uVar41 >> 0x20);
  uStack_24b2 = (undefined2)((ulong)uVar41 >> 0x30);
  local_24c8 = (undefined2)uVar55;
  uStack_24c6 = (undefined2)((ulong)uVar55 >> 0x10);
  uStack_24c4 = (undefined2)((ulong)uVar55 >> 0x20);
  uStack_24c2 = (undefined2)((ulong)uVar55 >> 0x30);
  uStack_22b0 = (undefined2)uVar42;
  uStack_22ae = (undefined2)((ulong)uVar42 >> 0x10);
  uStack_22ac = (undefined2)((ulong)uVar42 >> 0x20);
  uStack_22aa = (undefined2)((ulong)uVar42 >> 0x30);
  uStack_22c0 = (undefined2)uVar56;
  uStack_22be = (undefined2)((ulong)uVar56 >> 0x10);
  uStack_22bc = (undefined2)((ulong)uVar56 >> 0x20);
  uStack_22ba = (undefined2)((ulong)uVar56 >> 0x30);
  auVar141._2_2_ = local_24c8;
  auVar141._0_2_ = local_24b8;
  auVar141._4_2_ = uStack_24b6;
  auVar141._6_2_ = uStack_24c6;
  auVar141._10_2_ = uStack_24c4;
  auVar141._8_2_ = uStack_24b4;
  auVar141._12_2_ = uStack_24b2;
  auVar141._14_2_ = uStack_24c2;
  auVar140._8_8_ = CONCAT44(iVar246,iVar246);
  auVar140._0_8_ = CONCAT44(iVar246,iVar246);
  auVar271 = pmaddwd(auVar141,auVar140);
  auVar139._2_2_ = uStack_22c0;
  auVar139._0_2_ = uStack_22b0;
  auVar139._4_2_ = uStack_22ae;
  auVar139._6_2_ = uStack_22be;
  auVar139._10_2_ = uStack_22bc;
  auVar139._8_2_ = uStack_22ac;
  auVar139._12_2_ = uStack_22aa;
  auVar139._14_2_ = uStack_22ba;
  auVar138._8_8_ = CONCAT44(iVar246,iVar246);
  auVar138._0_8_ = CONCAT44(iVar246,iVar246);
  auVar272 = pmaddwd(auVar139,auVar138);
  auVar137._2_2_ = local_24c8;
  auVar137._0_2_ = local_24b8;
  auVar137._4_2_ = uStack_24b6;
  auVar137._6_2_ = uStack_24c6;
  auVar137._10_2_ = uStack_24c4;
  auVar137._8_2_ = uStack_24b4;
  auVar137._12_2_ = uStack_24b2;
  auVar137._14_2_ = uStack_24c2;
  auVar136._8_8_ = CONCAT44(uVar247,uVar247);
  auVar136._0_8_ = CONCAT44(uVar247,uVar247);
  auVar273 = pmaddwd(auVar137,auVar136);
  auVar135._2_2_ = uStack_22c0;
  auVar135._0_2_ = uStack_22b0;
  auVar135._4_2_ = uStack_22ae;
  auVar135._6_2_ = uStack_22be;
  auVar135._10_2_ = uStack_22bc;
  auVar135._8_2_ = uStack_22ac;
  auVar135._12_2_ = uStack_22aa;
  auVar135._14_2_ = uStack_22ba;
  auVar134._8_8_ = CONCAT44(uVar247,uVar247);
  auVar134._0_8_ = CONCAT44(uVar247,uVar247);
  auVar274 = pmaddwd(auVar135,auVar134);
  local_1438 = auVar271._0_4_;
  iStack_1434 = auVar271._4_4_;
  iStack_1430 = auVar271._8_4_;
  iStack_142c = auVar271._12_4_;
  local_1458 = auVar272._0_4_;
  iStack_1454 = auVar272._4_4_;
  iStack_1450 = auVar272._8_4_;
  iStack_144c = auVar272._12_4_;
  local_1478 = auVar273._0_4_;
  iStack_1474 = auVar273._4_4_;
  iStack_1470 = auVar273._8_4_;
  iStack_146c = auVar273._12_4_;
  local_1498 = auVar274._0_4_;
  iStack_1494 = auVar274._4_4_;
  iStack_1490 = auVar274._8_4_;
  iStack_148c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar221._4_4_ = iStack_1434 + 0x800 >> auVar271;
  auVar221._0_4_ = local_1438 + 0x800 >> auVar271;
  auVar221._12_4_ = iStack_142c + 0x800 >> auVar271;
  auVar221._8_4_ = iStack_1430 + 0x800 >> auVar271;
  auVar220._4_4_ = iStack_1454 + 0x800 >> auVar272;
  auVar220._0_4_ = local_1458 + 0x800 >> auVar272;
  auVar220._12_4_ = iStack_144c + 0x800 >> auVar272;
  auVar220._8_4_ = iStack_1450 + 0x800 >> auVar272;
  packssdw(auVar221,auVar220);
  auVar219._4_4_ = iStack_1474 + 0x800 >> auVar273;
  auVar219._0_4_ = local_1478 + 0x800 >> auVar273;
  auVar219._12_4_ = iStack_146c + 0x800 >> auVar273;
  auVar219._8_4_ = iStack_1470 + 0x800 >> auVar273;
  auVar218._4_4_ = iStack_1494 + 0x800 >> auVar274;
  auVar218._0_4_ = local_1498 + 0x800 >> auVar274;
  auVar218._12_4_ = iStack_148c + 0x800 >> auVar274;
  auVar218._8_4_ = iStack_1490 + 0x800 >> auVar274;
  packssdw(auVar219,auVar218);
  local_24d8 = (undefined2)uVar43;
  uStack_24d6 = (undefined2)((ulong)uVar43 >> 0x10);
  uStack_24d4 = (undefined2)((ulong)uVar43 >> 0x20);
  uStack_24d2 = (undefined2)((ulong)uVar43 >> 0x30);
  local_24e8 = (undefined2)uVar53;
  uStack_24e6 = (undefined2)((ulong)uVar53 >> 0x10);
  uStack_24e4 = (undefined2)((ulong)uVar53 >> 0x20);
  uStack_24e2 = (undefined2)((ulong)uVar53 >> 0x30);
  uStack_22d0 = (undefined2)uVar44;
  uStack_22ce = (undefined2)((ulong)uVar44 >> 0x10);
  uStack_22cc = (undefined2)((ulong)uVar44 >> 0x20);
  uStack_22ca = (undefined2)((ulong)uVar44 >> 0x30);
  uStack_22e0 = (undefined2)uVar54;
  uStack_22de = (undefined2)((ulong)uVar54 >> 0x10);
  uStack_22dc = (undefined2)((ulong)uVar54 >> 0x20);
  uStack_22da = (undefined2)((ulong)uVar54 >> 0x30);
  auVar133._2_2_ = local_24e8;
  auVar133._0_2_ = local_24d8;
  auVar133._4_2_ = uStack_24d6;
  auVar133._6_2_ = uStack_24e6;
  auVar133._10_2_ = uStack_24e4;
  auVar133._8_2_ = uStack_24d4;
  auVar133._12_2_ = uStack_24d2;
  auVar133._14_2_ = uStack_24e2;
  auVar132._8_8_ = CONCAT44(iVar248,iVar248);
  auVar132._0_8_ = CONCAT44(iVar248,iVar248);
  auVar271 = pmaddwd(auVar133,auVar132);
  auVar131._2_2_ = uStack_22e0;
  auVar131._0_2_ = uStack_22d0;
  auVar131._4_2_ = uStack_22ce;
  auVar131._6_2_ = uStack_22de;
  auVar131._10_2_ = uStack_22dc;
  auVar131._8_2_ = uStack_22cc;
  auVar131._12_2_ = uStack_22ca;
  auVar131._14_2_ = uStack_22da;
  auVar130._8_8_ = CONCAT44(iVar248,iVar248);
  auVar130._0_8_ = CONCAT44(iVar248,iVar248);
  auVar272 = pmaddwd(auVar131,auVar130);
  auVar129._2_2_ = local_24e8;
  auVar129._0_2_ = local_24d8;
  auVar129._4_2_ = uStack_24d6;
  auVar129._6_2_ = uStack_24e6;
  auVar129._10_2_ = uStack_24e4;
  auVar129._8_2_ = uStack_24d4;
  auVar129._12_2_ = uStack_24d2;
  auVar129._14_2_ = uStack_24e2;
  auVar128._8_8_ = CONCAT44(uVar249,uVar249);
  auVar128._0_8_ = CONCAT44(uVar249,uVar249);
  auVar273 = pmaddwd(auVar129,auVar128);
  auVar127._2_2_ = uStack_22e0;
  auVar127._0_2_ = uStack_22d0;
  auVar127._4_2_ = uStack_22ce;
  auVar127._6_2_ = uStack_22de;
  auVar127._10_2_ = uStack_22dc;
  auVar127._8_2_ = uStack_22cc;
  auVar127._12_2_ = uStack_22ca;
  auVar127._14_2_ = uStack_22da;
  auVar126._8_8_ = CONCAT44(uVar249,uVar249);
  auVar126._0_8_ = CONCAT44(uVar249,uVar249);
  auVar274 = pmaddwd(auVar127,auVar126);
  local_14b8 = auVar271._0_4_;
  iStack_14b4 = auVar271._4_4_;
  iStack_14b0 = auVar271._8_4_;
  iStack_14ac = auVar271._12_4_;
  local_14d8 = auVar272._0_4_;
  iStack_14d4 = auVar272._4_4_;
  iStack_14d0 = auVar272._8_4_;
  iStack_14cc = auVar272._12_4_;
  local_14f8 = auVar273._0_4_;
  iStack_14f4 = auVar273._4_4_;
  iStack_14f0 = auVar273._8_4_;
  iStack_14ec = auVar273._12_4_;
  local_1518 = auVar274._0_4_;
  iStack_1514 = auVar274._4_4_;
  iStack_1510 = auVar274._8_4_;
  iStack_150c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar217._4_4_ = iStack_14b4 + 0x800 >> auVar271;
  auVar217._0_4_ = local_14b8 + 0x800 >> auVar271;
  auVar217._12_4_ = iStack_14ac + 0x800 >> auVar271;
  auVar217._8_4_ = iStack_14b0 + 0x800 >> auVar271;
  auVar216._4_4_ = iStack_14d4 + 0x800 >> auVar272;
  auVar216._0_4_ = local_14d8 + 0x800 >> auVar272;
  auVar216._12_4_ = iStack_14cc + 0x800 >> auVar272;
  auVar216._8_4_ = iStack_14d0 + 0x800 >> auVar272;
  packssdw(auVar217,auVar216);
  auVar215._4_4_ = iStack_14f4 + 0x800 >> auVar273;
  auVar215._0_4_ = local_14f8 + 0x800 >> auVar273;
  auVar215._12_4_ = iStack_14ec + 0x800 >> auVar273;
  auVar215._8_4_ = iStack_14f0 + 0x800 >> auVar273;
  auVar214._4_4_ = iStack_1514 + 0x800 >> auVar274;
  auVar214._0_4_ = local_1518 + 0x800 >> auVar274;
  auVar214._12_4_ = iStack_150c + 0x800 >> auVar274;
  auVar214._8_4_ = iStack_1510 + 0x800 >> auVar274;
  packssdw(auVar215,auVar214);
  local_24f8 = (undefined2)uVar45;
  uStack_24f6 = (undefined2)((ulong)uVar45 >> 0x10);
  uStack_24f4 = (undefined2)((ulong)uVar45 >> 0x20);
  uStack_24f2 = (undefined2)((ulong)uVar45 >> 0x30);
  local_2508 = (undefined2)uVar51;
  uStack_2506 = (undefined2)((ulong)uVar51 >> 0x10);
  uStack_2504 = (undefined2)((ulong)uVar51 >> 0x20);
  uStack_2502 = (undefined2)((ulong)uVar51 >> 0x30);
  uStack_22f0 = (undefined2)uVar46;
  uStack_22ee = (undefined2)((ulong)uVar46 >> 0x10);
  uStack_22ec = (undefined2)((ulong)uVar46 >> 0x20);
  uStack_22ea = (undefined2)((ulong)uVar46 >> 0x30);
  uStack_2300 = (undefined2)uVar52;
  uStack_22fe = (undefined2)((ulong)uVar52 >> 0x10);
  uStack_22fc = (undefined2)((ulong)uVar52 >> 0x20);
  uStack_22fa = (undefined2)((ulong)uVar52 >> 0x30);
  auVar125._2_2_ = local_2508;
  auVar125._0_2_ = local_24f8;
  auVar125._4_2_ = uStack_24f6;
  auVar125._6_2_ = uStack_2506;
  auVar125._10_2_ = uStack_2504;
  auVar125._8_2_ = uStack_24f4;
  auVar125._12_2_ = uStack_24f2;
  auVar125._14_2_ = uStack_2502;
  auVar124._8_8_ = CONCAT44(iVar250,iVar250);
  auVar124._0_8_ = CONCAT44(iVar250,iVar250);
  auVar271 = pmaddwd(auVar125,auVar124);
  auVar123._2_2_ = uStack_2300;
  auVar123._0_2_ = uStack_22f0;
  auVar123._4_2_ = uStack_22ee;
  auVar123._6_2_ = uStack_22fe;
  auVar123._10_2_ = uStack_22fc;
  auVar123._8_2_ = uStack_22ec;
  auVar123._12_2_ = uStack_22ea;
  auVar123._14_2_ = uStack_22fa;
  auVar122._8_8_ = CONCAT44(iVar250,iVar250);
  auVar122._0_8_ = CONCAT44(iVar250,iVar250);
  auVar272 = pmaddwd(auVar123,auVar122);
  auVar121._2_2_ = local_2508;
  auVar121._0_2_ = local_24f8;
  auVar121._4_2_ = uStack_24f6;
  auVar121._6_2_ = uStack_2506;
  auVar121._10_2_ = uStack_2504;
  auVar121._8_2_ = uStack_24f4;
  auVar121._12_2_ = uStack_24f2;
  auVar121._14_2_ = uStack_2502;
  auVar120._8_8_ = CONCAT44(uVar251,uVar251);
  auVar120._0_8_ = CONCAT44(uVar251,uVar251);
  auVar273 = pmaddwd(auVar121,auVar120);
  auVar119._2_2_ = uStack_2300;
  auVar119._0_2_ = uStack_22f0;
  auVar119._4_2_ = uStack_22ee;
  auVar119._6_2_ = uStack_22fe;
  auVar119._10_2_ = uStack_22fc;
  auVar119._8_2_ = uStack_22ec;
  auVar119._12_2_ = uStack_22ea;
  auVar119._14_2_ = uStack_22fa;
  auVar118._8_8_ = CONCAT44(uVar251,uVar251);
  auVar118._0_8_ = CONCAT44(uVar251,uVar251);
  auVar274 = pmaddwd(auVar119,auVar118);
  local_1538 = auVar271._0_4_;
  iStack_1534 = auVar271._4_4_;
  iStack_1530 = auVar271._8_4_;
  iStack_152c = auVar271._12_4_;
  local_1558 = auVar272._0_4_;
  iStack_1554 = auVar272._4_4_;
  iStack_1550 = auVar272._8_4_;
  iStack_154c = auVar272._12_4_;
  local_1578 = auVar273._0_4_;
  iStack_1574 = auVar273._4_4_;
  iStack_1570 = auVar273._8_4_;
  iStack_156c = auVar273._12_4_;
  local_1598 = auVar274._0_4_;
  iStack_1594 = auVar274._4_4_;
  iStack_1590 = auVar274._8_4_;
  iStack_158c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar213._4_4_ = iStack_1534 + 0x800 >> auVar271;
  auVar213._0_4_ = local_1538 + 0x800 >> auVar271;
  auVar213._12_4_ = iStack_152c + 0x800 >> auVar271;
  auVar213._8_4_ = iStack_1530 + 0x800 >> auVar271;
  auVar212._4_4_ = iStack_1554 + 0x800 >> auVar272;
  auVar212._0_4_ = local_1558 + 0x800 >> auVar272;
  auVar212._12_4_ = iStack_154c + 0x800 >> auVar272;
  auVar212._8_4_ = iStack_1550 + 0x800 >> auVar272;
  packssdw(auVar213,auVar212);
  auVar211._4_4_ = iStack_1574 + 0x800 >> auVar273;
  auVar211._0_4_ = local_1578 + 0x800 >> auVar273;
  auVar211._12_4_ = iStack_156c + 0x800 >> auVar273;
  auVar211._8_4_ = iStack_1570 + 0x800 >> auVar273;
  auVar210._4_4_ = iStack_1594 + 0x800 >> auVar274;
  auVar210._0_4_ = local_1598 + 0x800 >> auVar274;
  auVar210._12_4_ = iStack_158c + 0x800 >> auVar274;
  auVar210._8_4_ = iStack_1590 + 0x800 >> auVar274;
  packssdw(auVar211,auVar210);
  local_2518 = (undefined2)uVar47;
  uStack_2516 = (undefined2)((ulong)uVar47 >> 0x10);
  uStack_2514 = (undefined2)((ulong)uVar47 >> 0x20);
  uStack_2512 = (undefined2)((ulong)uVar47 >> 0x30);
  local_2528 = (undefined2)uVar49;
  uStack_2526 = (undefined2)((ulong)uVar49 >> 0x10);
  uStack_2524 = (undefined2)((ulong)uVar49 >> 0x20);
  uStack_2522 = (undefined2)((ulong)uVar49 >> 0x30);
  uStack_2310 = (undefined2)uVar48;
  uStack_230e = (undefined2)((ulong)uVar48 >> 0x10);
  uStack_230c = (undefined2)((ulong)uVar48 >> 0x20);
  uStack_230a = (undefined2)((ulong)uVar48 >> 0x30);
  uStack_2320 = (undefined2)uVar50;
  uStack_231e = (undefined2)((ulong)uVar50 >> 0x10);
  uStack_231c = (undefined2)((ulong)uVar50 >> 0x20);
  uStack_231a = (undefined2)((ulong)uVar50 >> 0x30);
  auVar117._2_2_ = local_2528;
  auVar117._0_2_ = local_2518;
  auVar117._4_2_ = uStack_2516;
  auVar117._6_2_ = uStack_2526;
  auVar117._10_2_ = uStack_2524;
  auVar117._8_2_ = uStack_2514;
  auVar117._12_2_ = uStack_2512;
  auVar117._14_2_ = uStack_2522;
  auVar116._8_8_ = CONCAT44(iVar252,iVar252);
  auVar116._0_8_ = CONCAT44(iVar252,iVar252);
  auVar271 = pmaddwd(auVar117,auVar116);
  auVar115._2_2_ = uStack_2320;
  auVar115._0_2_ = uStack_2310;
  auVar115._4_2_ = uStack_230e;
  auVar115._6_2_ = uStack_231e;
  auVar115._10_2_ = uStack_231c;
  auVar115._8_2_ = uStack_230c;
  auVar115._12_2_ = uStack_230a;
  auVar115._14_2_ = uStack_231a;
  auVar114._8_8_ = CONCAT44(iVar252,iVar252);
  auVar114._0_8_ = CONCAT44(iVar252,iVar252);
  auVar272 = pmaddwd(auVar115,auVar114);
  auVar113._2_2_ = local_2528;
  auVar113._0_2_ = local_2518;
  auVar113._4_2_ = uStack_2516;
  auVar113._6_2_ = uStack_2526;
  auVar113._10_2_ = uStack_2524;
  auVar113._8_2_ = uStack_2514;
  auVar113._12_2_ = uStack_2512;
  auVar113._14_2_ = uStack_2522;
  auVar112._8_8_ = CONCAT44(uVar253,uVar253);
  auVar112._0_8_ = CONCAT44(uVar253,uVar253);
  auVar273 = pmaddwd(auVar113,auVar112);
  auVar111._2_2_ = uStack_2320;
  auVar111._0_2_ = uStack_2310;
  auVar111._4_2_ = uStack_230e;
  auVar111._6_2_ = uStack_231e;
  auVar111._10_2_ = uStack_231c;
  auVar111._8_2_ = uStack_230c;
  auVar111._12_2_ = uStack_230a;
  auVar111._14_2_ = uStack_231a;
  auVar110._8_8_ = CONCAT44(uVar253,uVar253);
  auVar110._0_8_ = CONCAT44(uVar253,uVar253);
  auVar274 = pmaddwd(auVar111,auVar110);
  local_15b8 = auVar271._0_4_;
  iStack_15b4 = auVar271._4_4_;
  iStack_15b0 = auVar271._8_4_;
  iStack_15ac = auVar271._12_4_;
  local_15d8 = auVar272._0_4_;
  iStack_15d4 = auVar272._4_4_;
  iStack_15d0 = auVar272._8_4_;
  iStack_15cc = auVar272._12_4_;
  local_15f8 = auVar273._0_4_;
  iStack_15f4 = auVar273._4_4_;
  iStack_15f0 = auVar273._8_4_;
  iStack_15ec = auVar273._12_4_;
  local_1618 = auVar274._0_4_;
  iStack_1614 = auVar274._4_4_;
  iStack_1610 = auVar274._8_4_;
  iStack_160c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar209._4_4_ = iStack_15b4 + 0x800 >> auVar271;
  auVar209._0_4_ = local_15b8 + 0x800 >> auVar271;
  auVar209._12_4_ = iStack_15ac + 0x800 >> auVar271;
  auVar209._8_4_ = iStack_15b0 + 0x800 >> auVar271;
  auVar208._4_4_ = iStack_15d4 + 0x800 >> auVar272;
  auVar208._0_4_ = local_15d8 + 0x800 >> auVar272;
  auVar208._12_4_ = iStack_15cc + 0x800 >> auVar272;
  auVar208._8_4_ = iStack_15d0 + 0x800 >> auVar272;
  packssdw(auVar209,auVar208);
  auVar207._4_4_ = iStack_15f4 + 0x800 >> auVar273;
  auVar207._0_4_ = local_15f8 + 0x800 >> auVar273;
  auVar207._12_4_ = iStack_15ec + 0x800 >> auVar273;
  auVar207._8_4_ = iStack_15f0 + 0x800 >> auVar273;
  auVar206._4_4_ = iStack_1614 + 0x800 >> auVar274;
  auVar206._0_4_ = local_1618 + 0x800 >> auVar274;
  auVar206._12_4_ = iStack_160c + 0x800 >> auVar274;
  auVar206._8_4_ = iStack_1610 + 0x800 >> auVar274;
  packssdw(auVar207,auVar206);
  local_2538 = (undefined2)uVar17;
  uStack_2536 = (undefined2)((ulong)uVar17 >> 0x10);
  uStack_2534 = (undefined2)((ulong)uVar17 >> 0x20);
  uStack_2532 = (undefined2)((ulong)uVar17 >> 0x30);
  local_2548 = (undefined2)uVar31;
  uStack_2546 = (undefined2)((ulong)uVar31 >> 0x10);
  uStack_2544 = (undefined2)((ulong)uVar31 >> 0x20);
  uStack_2542 = (undefined2)((ulong)uVar31 >> 0x30);
  uStack_2330 = (undefined2)uVar18;
  uStack_232e = (undefined2)((ulong)uVar18 >> 0x10);
  uStack_232c = (undefined2)((ulong)uVar18 >> 0x20);
  uStack_232a = (undefined2)((ulong)uVar18 >> 0x30);
  uStack_2340 = (undefined2)uVar32;
  uStack_233e = (undefined2)((ulong)uVar32 >> 0x10);
  uStack_233c = (undefined2)((ulong)uVar32 >> 0x20);
  uStack_233a = (undefined2)((ulong)uVar32 >> 0x30);
  auVar109._2_2_ = local_2548;
  auVar109._0_2_ = local_2538;
  auVar109._4_2_ = uStack_2536;
  auVar109._6_2_ = uStack_2546;
  auVar109._10_2_ = uStack_2544;
  auVar109._8_2_ = uStack_2534;
  auVar109._12_2_ = uStack_2532;
  auVar109._14_2_ = uStack_2542;
  auVar108._8_8_ = CONCAT44(iVar254,iVar254);
  auVar108._0_8_ = CONCAT44(iVar254,iVar254);
  auVar271 = pmaddwd(auVar109,auVar108);
  auVar107._2_2_ = uStack_2340;
  auVar107._0_2_ = uStack_2330;
  auVar107._4_2_ = uStack_232e;
  auVar107._6_2_ = uStack_233e;
  auVar107._10_2_ = uStack_233c;
  auVar107._8_2_ = uStack_232c;
  auVar107._12_2_ = uStack_232a;
  auVar107._14_2_ = uStack_233a;
  auVar106._8_8_ = CONCAT44(iVar254,iVar254);
  auVar106._0_8_ = CONCAT44(iVar254,iVar254);
  auVar272 = pmaddwd(auVar107,auVar106);
  auVar105._2_2_ = local_2548;
  auVar105._0_2_ = local_2538;
  auVar105._4_2_ = uStack_2536;
  auVar105._6_2_ = uStack_2546;
  auVar105._10_2_ = uStack_2544;
  auVar105._8_2_ = uStack_2534;
  auVar105._12_2_ = uStack_2532;
  auVar105._14_2_ = uStack_2542;
  auVar104._8_8_ = CONCAT44(uVar255,uVar255);
  auVar104._0_8_ = CONCAT44(uVar255,uVar255);
  auVar273 = pmaddwd(auVar105,auVar104);
  auVar103._2_2_ = uStack_2340;
  auVar103._0_2_ = uStack_2330;
  auVar103._4_2_ = uStack_232e;
  auVar103._6_2_ = uStack_233e;
  auVar103._10_2_ = uStack_233c;
  auVar103._8_2_ = uStack_232c;
  auVar103._12_2_ = uStack_232a;
  auVar103._14_2_ = uStack_233a;
  auVar102._8_8_ = CONCAT44(uVar255,uVar255);
  auVar102._0_8_ = CONCAT44(uVar255,uVar255);
  auVar274 = pmaddwd(auVar103,auVar102);
  local_1638 = auVar271._0_4_;
  iStack_1634 = auVar271._4_4_;
  iStack_1630 = auVar271._8_4_;
  iStack_162c = auVar271._12_4_;
  local_1658 = auVar272._0_4_;
  iStack_1654 = auVar272._4_4_;
  iStack_1650 = auVar272._8_4_;
  iStack_164c = auVar272._12_4_;
  local_1678 = auVar273._0_4_;
  iStack_1674 = auVar273._4_4_;
  iStack_1670 = auVar273._8_4_;
  iStack_166c = auVar273._12_4_;
  local_1698 = auVar274._0_4_;
  iStack_1694 = auVar274._4_4_;
  iStack_1690 = auVar274._8_4_;
  iStack_168c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar205._4_4_ = iStack_1634 + 0x800 >> auVar271;
  auVar205._0_4_ = local_1638 + 0x800 >> auVar271;
  auVar205._12_4_ = iStack_162c + 0x800 >> auVar271;
  auVar205._8_4_ = iStack_1630 + 0x800 >> auVar271;
  auVar204._4_4_ = iStack_1654 + 0x800 >> auVar272;
  auVar204._0_4_ = local_1658 + 0x800 >> auVar272;
  auVar204._12_4_ = iStack_164c + 0x800 >> auVar272;
  auVar204._8_4_ = iStack_1650 + 0x800 >> auVar272;
  auVar271 = packssdw(auVar205,auVar204);
  auVar203._4_4_ = iStack_1674 + 0x800 >> auVar273;
  auVar203._0_4_ = local_1678 + 0x800 >> auVar273;
  auVar203._12_4_ = iStack_166c + 0x800 >> auVar273;
  auVar203._8_4_ = iStack_1670 + 0x800 >> auVar273;
  auVar202._4_4_ = iStack_1694 + 0x800 >> auVar274;
  auVar202._0_4_ = local_1698 + 0x800 >> auVar274;
  auVar202._12_4_ = iStack_168c + 0x800 >> auVar274;
  auVar202._8_4_ = iStack_1690 + 0x800 >> auVar274;
  auVar272 = packssdw(auVar203,auVar202);
  local_2558 = (undefined2)uVar19;
  uStack_2556 = (undefined2)((ulong)uVar19 >> 0x10);
  uStack_2554 = (undefined2)((ulong)uVar19 >> 0x20);
  uStack_2552 = (undefined2)((ulong)uVar19 >> 0x30);
  local_2568 = (undefined2)uVar29;
  uStack_2566 = (undefined2)((ulong)uVar29 >> 0x10);
  uStack_2564 = (undefined2)((ulong)uVar29 >> 0x20);
  uStack_2562 = (undefined2)((ulong)uVar29 >> 0x30);
  uStack_2350 = (undefined2)uVar20;
  uStack_234e = (undefined2)((ulong)uVar20 >> 0x10);
  uStack_234c = (undefined2)((ulong)uVar20 >> 0x20);
  uStack_234a = (undefined2)((ulong)uVar20 >> 0x30);
  uStack_2360 = (undefined2)uVar30;
  uStack_235e = (undefined2)((ulong)uVar30 >> 0x10);
  uStack_235c = (undefined2)((ulong)uVar30 >> 0x20);
  uStack_235a = (undefined2)((ulong)uVar30 >> 0x30);
  auVar101._2_2_ = local_2568;
  auVar101._0_2_ = local_2558;
  auVar101._4_2_ = uStack_2556;
  auVar101._6_2_ = uStack_2566;
  auVar101._10_2_ = uStack_2564;
  auVar101._8_2_ = uStack_2554;
  auVar101._12_2_ = uStack_2552;
  auVar101._14_2_ = uStack_2562;
  auVar100._8_8_ = CONCAT44(iVar256,iVar256);
  auVar100._0_8_ = CONCAT44(iVar256,iVar256);
  auVar273 = pmaddwd(auVar101,auVar100);
  auVar99._2_2_ = uStack_2360;
  auVar99._0_2_ = uStack_2350;
  auVar99._4_2_ = uStack_234e;
  auVar99._6_2_ = uStack_235e;
  auVar99._10_2_ = uStack_235c;
  auVar99._8_2_ = uStack_234c;
  auVar99._12_2_ = uStack_234a;
  auVar99._14_2_ = uStack_235a;
  auVar98._8_8_ = CONCAT44(iVar256,iVar256);
  auVar98._0_8_ = CONCAT44(iVar256,iVar256);
  auVar274 = pmaddwd(auVar99,auVar98);
  auVar97._2_2_ = local_2568;
  auVar97._0_2_ = local_2558;
  auVar97._4_2_ = uStack_2556;
  auVar97._6_2_ = uStack_2566;
  auVar97._10_2_ = uStack_2564;
  auVar97._8_2_ = uStack_2554;
  auVar97._12_2_ = uStack_2552;
  auVar97._14_2_ = uStack_2562;
  auVar96._8_8_ = CONCAT44(uVar257,uVar257);
  auVar96._0_8_ = CONCAT44(uVar257,uVar257);
  auVar275 = pmaddwd(auVar97,auVar96);
  auVar95._2_2_ = uStack_2360;
  auVar95._0_2_ = uStack_2350;
  auVar95._4_2_ = uStack_234e;
  auVar95._6_2_ = uStack_235e;
  auVar95._10_2_ = uStack_235c;
  auVar95._8_2_ = uStack_234c;
  auVar95._12_2_ = uStack_234a;
  auVar95._14_2_ = uStack_235a;
  auVar94._8_8_ = CONCAT44(uVar257,uVar257);
  auVar94._0_8_ = CONCAT44(uVar257,uVar257);
  auVar276 = pmaddwd(auVar95,auVar94);
  local_16b8 = auVar273._0_4_;
  iStack_16b4 = auVar273._4_4_;
  iStack_16b0 = auVar273._8_4_;
  iStack_16ac = auVar273._12_4_;
  local_16d8 = auVar274._0_4_;
  iStack_16d4 = auVar274._4_4_;
  iStack_16d0 = auVar274._8_4_;
  iStack_16cc = auVar274._12_4_;
  local_16f8 = auVar275._0_4_;
  iStack_16f4 = auVar275._4_4_;
  iStack_16f0 = auVar275._8_4_;
  iStack_16ec = auVar275._12_4_;
  local_1718 = auVar276._0_4_;
  iStack_1714 = auVar276._4_4_;
  iStack_1710 = auVar276._8_4_;
  iStack_170c = auVar276._12_4_;
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar275 = ZEXT416(0xc);
  auVar276 = ZEXT416(0xc);
  auVar201._4_4_ = iStack_16b4 + 0x800 >> auVar273;
  auVar201._0_4_ = local_16b8 + 0x800 >> auVar273;
  auVar201._12_4_ = iStack_16ac + 0x800 >> auVar273;
  auVar201._8_4_ = iStack_16b0 + 0x800 >> auVar273;
  auVar200._4_4_ = iStack_16d4 + 0x800 >> auVar274;
  auVar200._0_4_ = local_16d8 + 0x800 >> auVar274;
  auVar200._12_4_ = iStack_16cc + 0x800 >> auVar274;
  auVar200._8_4_ = iStack_16d0 + 0x800 >> auVar274;
  auVar273 = packssdw(auVar201,auVar200);
  auVar199._4_4_ = iStack_16f4 + 0x800 >> auVar275;
  auVar199._0_4_ = local_16f8 + 0x800 >> auVar275;
  auVar199._12_4_ = iStack_16ec + 0x800 >> auVar275;
  auVar199._8_4_ = iStack_16f0 + 0x800 >> auVar275;
  auVar198._4_4_ = iStack_1714 + 0x800 >> auVar276;
  auVar198._0_4_ = local_1718 + 0x800 >> auVar276;
  auVar198._12_4_ = iStack_170c + 0x800 >> auVar276;
  auVar198._8_4_ = iStack_1710 + 0x800 >> auVar276;
  auVar274 = packssdw(auVar199,auVar198);
  local_2578 = (undefined2)uVar21;
  uStack_2576 = (undefined2)((ulong)uVar21 >> 0x10);
  uStack_2574 = (undefined2)((ulong)uVar21 >> 0x20);
  uStack_2572 = (undefined2)((ulong)uVar21 >> 0x30);
  local_2588 = (undefined2)uVar27;
  uStack_2586 = (undefined2)((ulong)uVar27 >> 0x10);
  uStack_2584 = (undefined2)((ulong)uVar27 >> 0x20);
  uStack_2582 = (undefined2)((ulong)uVar27 >> 0x30);
  uStack_2370 = (undefined2)uVar22;
  uStack_236e = (undefined2)((ulong)uVar22 >> 0x10);
  uStack_236c = (undefined2)((ulong)uVar22 >> 0x20);
  uStack_236a = (undefined2)((ulong)uVar22 >> 0x30);
  uStack_2380 = (undefined2)uVar28;
  uStack_237e = (undefined2)((ulong)uVar28 >> 0x10);
  uStack_237c = (undefined2)((ulong)uVar28 >> 0x20);
  uStack_237a = (undefined2)((ulong)uVar28 >> 0x30);
  auVar93._2_2_ = local_2588;
  auVar93._0_2_ = local_2578;
  auVar93._4_2_ = uStack_2576;
  auVar93._6_2_ = uStack_2586;
  auVar93._10_2_ = uStack_2584;
  auVar93._8_2_ = uStack_2574;
  auVar93._12_2_ = uStack_2572;
  auVar93._14_2_ = uStack_2582;
  auVar92._8_8_ = CONCAT44(iVar258,iVar258);
  auVar92._0_8_ = CONCAT44(iVar258,iVar258);
  auVar275 = pmaddwd(auVar93,auVar92);
  auVar91._2_2_ = uStack_2380;
  auVar91._0_2_ = uStack_2370;
  auVar91._4_2_ = uStack_236e;
  auVar91._6_2_ = uStack_237e;
  auVar91._10_2_ = uStack_237c;
  auVar91._8_2_ = uStack_236c;
  auVar91._12_2_ = uStack_236a;
  auVar91._14_2_ = uStack_237a;
  auVar90._8_8_ = CONCAT44(iVar258,iVar258);
  auVar90._0_8_ = CONCAT44(iVar258,iVar258);
  auVar276 = pmaddwd(auVar91,auVar90);
  auVar89._2_2_ = local_2588;
  auVar89._0_2_ = local_2578;
  auVar89._4_2_ = uStack_2576;
  auVar89._6_2_ = uStack_2586;
  auVar89._10_2_ = uStack_2584;
  auVar89._8_2_ = uStack_2574;
  auVar89._12_2_ = uStack_2572;
  auVar89._14_2_ = uStack_2582;
  auVar88._8_8_ = CONCAT44(uVar259,uVar259);
  auVar88._0_8_ = CONCAT44(uVar259,uVar259);
  auVar277 = pmaddwd(auVar89,auVar88);
  auVar87._2_2_ = uStack_2380;
  auVar87._0_2_ = uStack_2370;
  auVar87._4_2_ = uStack_236e;
  auVar87._6_2_ = uStack_237e;
  auVar87._10_2_ = uStack_237c;
  auVar87._8_2_ = uStack_236c;
  auVar87._12_2_ = uStack_236a;
  auVar87._14_2_ = uStack_237a;
  auVar86._8_8_ = CONCAT44(uVar259,uVar259);
  auVar86._0_8_ = CONCAT44(uVar259,uVar259);
  auVar278 = pmaddwd(auVar87,auVar86);
  local_1738 = auVar275._0_4_;
  iStack_1734 = auVar275._4_4_;
  iStack_1730 = auVar275._8_4_;
  iStack_172c = auVar275._12_4_;
  local_1758 = auVar276._0_4_;
  iStack_1754 = auVar276._4_4_;
  iStack_1750 = auVar276._8_4_;
  iStack_174c = auVar276._12_4_;
  local_1778 = auVar277._0_4_;
  iStack_1774 = auVar277._4_4_;
  iStack_1770 = auVar277._8_4_;
  iStack_176c = auVar277._12_4_;
  local_1798 = auVar278._0_4_;
  iStack_1794 = auVar278._4_4_;
  iStack_1790 = auVar278._8_4_;
  iStack_178c = auVar278._12_4_;
  auVar275 = ZEXT416(0xc);
  auVar276 = ZEXT416(0xc);
  auVar277 = ZEXT416(0xc);
  auVar278 = ZEXT416(0xc);
  auVar197._4_4_ = iStack_1734 + 0x800 >> auVar275;
  auVar197._0_4_ = local_1738 + 0x800 >> auVar275;
  auVar197._12_4_ = iStack_172c + 0x800 >> auVar275;
  auVar197._8_4_ = iStack_1730 + 0x800 >> auVar275;
  auVar196._4_4_ = iStack_1754 + 0x800 >> auVar276;
  auVar196._0_4_ = local_1758 + 0x800 >> auVar276;
  auVar196._12_4_ = iStack_174c + 0x800 >> auVar276;
  auVar196._8_4_ = iStack_1750 + 0x800 >> auVar276;
  auVar275 = packssdw(auVar197,auVar196);
  auVar195._4_4_ = iStack_1774 + 0x800 >> auVar277;
  auVar195._0_4_ = local_1778 + 0x800 >> auVar277;
  auVar195._12_4_ = iStack_176c + 0x800 >> auVar277;
  auVar195._8_4_ = iStack_1770 + 0x800 >> auVar277;
  auVar194._4_4_ = iStack_1794 + 0x800 >> auVar278;
  auVar194._0_4_ = local_1798 + 0x800 >> auVar278;
  auVar194._12_4_ = iStack_178c + 0x800 >> auVar278;
  auVar194._8_4_ = iStack_1790 + 0x800 >> auVar278;
  auVar276 = packssdw(auVar195,auVar194);
  local_2598 = (undefined2)uVar23;
  uStack_2596 = (undefined2)((ulong)uVar23 >> 0x10);
  uStack_2594 = (undefined2)((ulong)uVar23 >> 0x20);
  uStack_2592 = (undefined2)((ulong)uVar23 >> 0x30);
  local_25a8 = (undefined2)uVar25;
  uStack_25a6 = (undefined2)((ulong)uVar25 >> 0x10);
  uStack_25a4 = (undefined2)((ulong)uVar25 >> 0x20);
  uStack_25a2 = (undefined2)((ulong)uVar25 >> 0x30);
  uStack_2390 = (undefined2)uVar24;
  uStack_238e = (undefined2)((ulong)uVar24 >> 0x10);
  uStack_238c = (undefined2)((ulong)uVar24 >> 0x20);
  uStack_238a = (undefined2)((ulong)uVar24 >> 0x30);
  uStack_23a0 = (undefined2)uVar26;
  uStack_239e = (undefined2)((ulong)uVar26 >> 0x10);
  uStack_239c = (undefined2)((ulong)uVar26 >> 0x20);
  uStack_239a = (undefined2)((ulong)uVar26 >> 0x30);
  auVar85._2_2_ = local_25a8;
  auVar85._0_2_ = local_2598;
  auVar85._4_2_ = uStack_2596;
  auVar85._6_2_ = uStack_25a6;
  auVar85._10_2_ = uStack_25a4;
  auVar85._8_2_ = uStack_2594;
  auVar85._12_2_ = uStack_2592;
  auVar85._14_2_ = uStack_25a2;
  auVar84._8_8_ = CONCAT44(iVar260,iVar260);
  auVar84._0_8_ = CONCAT44(iVar260,iVar260);
  auVar277 = pmaddwd(auVar85,auVar84);
  auVar83._2_2_ = uStack_23a0;
  auVar83._0_2_ = uStack_2390;
  auVar83._4_2_ = uStack_238e;
  auVar83._6_2_ = uStack_239e;
  auVar83._10_2_ = uStack_239c;
  auVar83._8_2_ = uStack_238c;
  auVar83._12_2_ = uStack_238a;
  auVar83._14_2_ = uStack_239a;
  auVar82._8_8_ = CONCAT44(iVar260,iVar260);
  auVar82._0_8_ = CONCAT44(iVar260,iVar260);
  auVar278 = pmaddwd(auVar83,auVar82);
  auVar81._2_2_ = local_25a8;
  auVar81._0_2_ = local_2598;
  auVar81._4_2_ = uStack_2596;
  auVar81._6_2_ = uStack_25a6;
  auVar81._10_2_ = uStack_25a4;
  auVar81._8_2_ = uStack_2594;
  auVar81._12_2_ = uStack_2592;
  auVar81._14_2_ = uStack_25a2;
  auVar80._8_8_ = CONCAT44(uVar261,uVar261);
  auVar80._0_8_ = CONCAT44(uVar261,uVar261);
  auVar279 = pmaddwd(auVar81,auVar80);
  auVar79._2_2_ = uStack_23a0;
  auVar79._0_2_ = uStack_2390;
  auVar79._4_2_ = uStack_238e;
  auVar79._6_2_ = uStack_239e;
  auVar79._10_2_ = uStack_239c;
  auVar79._8_2_ = uStack_238c;
  auVar79._12_2_ = uStack_238a;
  auVar79._14_2_ = uStack_239a;
  auVar78._8_8_ = CONCAT44(uVar261,uVar261);
  auVar78._0_8_ = CONCAT44(uVar261,uVar261);
  auVar280 = pmaddwd(auVar79,auVar78);
  local_17b8 = auVar277._0_4_;
  iStack_17b4 = auVar277._4_4_;
  iStack_17b0 = auVar277._8_4_;
  iStack_17ac = auVar277._12_4_;
  local_17d8 = auVar278._0_4_;
  iStack_17d4 = auVar278._4_4_;
  iStack_17d0 = auVar278._8_4_;
  iStack_17cc = auVar278._12_4_;
  local_17f8 = auVar279._0_4_;
  iStack_17f4 = auVar279._4_4_;
  iStack_17f0 = auVar279._8_4_;
  iStack_17ec = auVar279._12_4_;
  local_17f8 = local_17f8 + 0x800;
  iStack_17f4 = iStack_17f4 + 0x800;
  iStack_17f0 = iStack_17f0 + 0x800;
  iStack_17ec = iStack_17ec + 0x800;
  local_1818 = auVar280._0_4_;
  iStack_1814 = auVar280._4_4_;
  iStack_1810 = auVar280._8_4_;
  iStack_180c = auVar280._12_4_;
  local_1818 = local_1818 + 0x800;
  iStack_1814 = iStack_1814 + 0x800;
  auVar277 = ZEXT416(0xc);
  iVar238 = iStack_17b4 + 0x800 >> auVar277;
  iVar246 = iStack_17b0 + 0x800 >> auVar277;
  iVar252 = iStack_17ac + 0x800 >> auVar277;
  auVar278 = ZEXT416(0xc);
  auVar279 = ZEXT416(0xc);
  auVar280 = ZEXT416(0xc);
  auVar193._4_4_ = iVar238;
  auVar193._0_4_ = local_17b8 + 0x800 >> auVar277;
  auVar193._12_4_ = iVar252;
  auVar193._8_4_ = iVar246;
  auVar192._4_4_ = iStack_17d4 + 0x800 >> auVar278;
  auVar192._0_4_ = local_17d8 + 0x800 >> auVar278;
  auVar192._12_4_ = iStack_17cc + 0x800 >> auVar278;
  auVar192._8_4_ = iStack_17d0 + 0x800 >> auVar278;
  auVar277 = packssdw(auVar193,auVar192);
  auVar191._4_4_ = iStack_17f4 >> auVar279;
  auVar191._0_4_ = local_17f8 >> auVar279;
  auVar191._12_4_ = iStack_17ec >> auVar279;
  auVar191._8_4_ = iStack_17f0 >> auVar279;
  auVar190._4_4_ = iStack_1814 >> auVar280;
  auVar190._0_4_ = local_1818 >> auVar280;
  auVar190._12_4_ = iStack_180c + 0x800 >> auVar280;
  auVar190._8_4_ = iStack_1810 + 0x800 >> auVar280;
  auVar278 = packssdw(auVar191,auVar190);
  idct32_high16_stage3_sse2
            ((__m128i *)CONCAT44(in_stack_ffffffffffffc69c,in_stack_ffffffffffffc698));
  cos_bit_02 = (int8_t)((uint)iVar238 >> 0x18);
  local_25b8 = (undefined2)uVar9;
  uStack_25b6 = (undefined2)((ulong)uVar9 >> 0x10);
  uStack_25b4 = (undefined2)((ulong)uVar9 >> 0x20);
  uStack_25b2 = (undefined2)((ulong)uVar9 >> 0x30);
  local_25c8 = (undefined2)uVar15;
  uStack_25c6 = (undefined2)((ulong)uVar15 >> 0x10);
  uStack_25c4 = (undefined2)((ulong)uVar15 >> 0x20);
  uStack_25c2 = (undefined2)((ulong)uVar15 >> 0x30);
  uStack_23b0 = (undefined2)uVar10;
  uStack_23ae = (undefined2)((ulong)uVar10 >> 0x10);
  uStack_23ac = (undefined2)((ulong)uVar10 >> 0x20);
  uStack_23aa = (undefined2)((ulong)uVar10 >> 0x30);
  uStack_23c0 = (undefined2)uVar16;
  uStack_23be = (undefined2)((ulong)uVar16 >> 0x10);
  uStack_23bc = (undefined2)((ulong)uVar16 >> 0x20);
  uStack_23ba = (undefined2)((ulong)uVar16 >> 0x30);
  auVar77._2_2_ = local_25c8;
  auVar77._0_2_ = local_25b8;
  auVar77._4_2_ = uStack_25b6;
  auVar77._6_2_ = uStack_25c6;
  auVar77._10_2_ = uStack_25c4;
  auVar77._8_2_ = uStack_25b4;
  auVar77._12_2_ = uStack_25b2;
  auVar77._14_2_ = uStack_25c2;
  auVar76._8_8_ = CONCAT44(iVar262,iVar262);
  auVar76._0_8_ = CONCAT44(iVar262,iVar262);
  auVar279 = pmaddwd(auVar77,auVar76);
  auVar75._2_2_ = uStack_23c0;
  auVar75._0_2_ = uStack_23b0;
  auVar75._4_2_ = uStack_23ae;
  auVar75._6_2_ = uStack_23be;
  auVar75._10_2_ = uStack_23bc;
  auVar75._8_2_ = uStack_23ac;
  auVar75._12_2_ = uStack_23aa;
  auVar75._14_2_ = uStack_23ba;
  auVar281._8_8_ = CONCAT44(iVar262,iVar262);
  auVar281._0_8_ = CONCAT44(iVar262,iVar262);
  auVar281 = pmaddwd(auVar75,auVar281);
  auVar74._2_2_ = local_25c8;
  auVar74._0_2_ = local_25b8;
  auVar74._4_2_ = uStack_25b6;
  auVar74._6_2_ = uStack_25c6;
  auVar74._10_2_ = uStack_25c4;
  auVar74._8_2_ = uStack_25b4;
  auVar74._12_2_ = uStack_25b2;
  auVar74._14_2_ = uStack_25c2;
  auVar73._8_8_ = CONCAT44(uVar263,uVar263);
  auVar73._0_8_ = CONCAT44(uVar263,uVar263);
  auVar280 = pmaddwd(auVar74,auVar73);
  lVar291 = auVar280._0_8_;
  auVar284._2_2_ = uStack_23c0;
  auVar284._0_2_ = uStack_23b0;
  auVar284._4_2_ = uStack_23ae;
  auVar284._6_2_ = uStack_23be;
  auVar284._10_2_ = uStack_23bc;
  auVar284._8_2_ = uStack_23ac;
  auVar284._12_2_ = uStack_23aa;
  auVar284._14_2_ = uStack_23ba;
  auVar283._8_8_ = CONCAT44(uVar263,uVar263);
  auVar283._0_8_ = CONCAT44(uVar263,uVar263);
  auVar282 = pmaddwd(auVar284,auVar283);
  cos_bit_01 = auVar282[7];
  lVar290 = auVar282._8_8_;
  local_1838 = auVar279._0_4_;
  iStack_1834 = auVar279._4_4_;
  iStack_1830 = auVar279._8_4_;
  iStack_182c = auVar279._12_4_;
  local_1858 = auVar281._0_4_;
  iStack_1854 = auVar281._4_4_;
  iStack_1850 = auVar281._8_4_;
  iStack_184c = auVar281._12_4_;
  local_1878 = auVar280._0_4_;
  iStack_1874 = auVar280._4_4_;
  iStack_1870 = auVar280._8_4_;
  iStack_186c = auVar280._12_4_;
  local_1898 = auVar282._0_4_;
  iStack_1894 = auVar282._4_4_;
  iStack_1890 = auVar282._8_4_;
  iStack_188c = auVar282._12_4_;
  auVar279 = ZEXT416(0xc);
  auVar280 = ZEXT416(0xc);
  auVar282 = ZEXT416(0xc);
  auVar287 = ZEXT416(0xc);
  auVar189._4_4_ = iStack_1834 + 0x800 >> auVar279;
  auVar189._0_4_ = local_1838 + 0x800 >> auVar279;
  auVar189._12_4_ = iStack_182c + 0x800 >> auVar279;
  auVar189._8_4_ = iStack_1830 + 0x800 >> auVar279;
  auVar188._4_4_ = iStack_1854 + 0x800 >> auVar280;
  auVar188._0_4_ = local_1858 + 0x800 >> auVar280;
  auVar188._12_4_ = iStack_184c + 0x800 >> auVar280;
  auVar188._8_4_ = iStack_1850 + 0x800 >> auVar280;
  auVar283 = packssdw(auVar189,auVar188);
  auVar187._4_4_ = iStack_1874 + 0x800 >> auVar282;
  auVar187._0_4_ = local_1878 + 0x800 >> auVar282;
  auVar187._12_4_ = iStack_186c + 0x800 >> auVar282;
  auVar187._8_4_ = iStack_1870 + 0x800 >> auVar282;
  auVar186._4_4_ = iStack_1894 + 0x800 >> auVar287;
  auVar186._0_4_ = local_1898 + 0x800 >> auVar287;
  auVar186._12_4_ = iStack_188c + 0x800 >> auVar287;
  auVar186._8_4_ = iStack_1890 + 0x800 >> auVar287;
  auVar284 = packssdw(auVar187,auVar186);
  local_25d8 = (undefined2)uVar11;
  uStack_25d6 = (undefined2)((ulong)uVar11 >> 0x10);
  uStack_25d4 = (undefined2)((ulong)uVar11 >> 0x20);
  uStack_25d2 = (undefined2)((ulong)uVar11 >> 0x30);
  local_25e8 = (undefined2)uVar13;
  uStack_25e6 = (undefined2)((ulong)uVar13 >> 0x10);
  uStack_25e4 = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_25e2 = (undefined2)((ulong)uVar13 >> 0x30);
  uStack_23d0 = (undefined2)uVar12;
  uStack_23ce = (undefined2)((ulong)uVar12 >> 0x10);
  uStack_23cc = (undefined2)((ulong)uVar12 >> 0x20);
  uStack_23ca = (undefined2)((ulong)uVar12 >> 0x30);
  uStack_23e0 = (undefined2)uVar14;
  uStack_23de = (undefined2)((ulong)uVar14 >> 0x10);
  uStack_23dc = (undefined2)((ulong)uVar14 >> 0x20);
  uStack_23da = (undefined2)((ulong)uVar14 >> 0x30);
  auVar72._2_2_ = local_25e8;
  auVar72._0_2_ = local_25d8;
  auVar72._4_2_ = uStack_25d6;
  auVar72._6_2_ = uStack_25e6;
  auVar72._10_2_ = uStack_25e4;
  auVar72._8_2_ = uStack_25d4;
  auVar72._12_2_ = uStack_25d2;
  auVar72._14_2_ = uStack_25e2;
  auVar71._8_8_ = CONCAT44(iVar264,iVar264);
  auVar71._0_8_ = CONCAT44(iVar264,iVar264);
  auVar279 = pmaddwd(auVar72,auVar71);
  auVar70._2_2_ = uStack_23e0;
  auVar70._0_2_ = uStack_23d0;
  auVar70._4_2_ = uStack_23ce;
  auVar70._6_2_ = uStack_23de;
  auVar70._10_2_ = uStack_23dc;
  auVar70._8_2_ = uStack_23cc;
  auVar70._12_2_ = uStack_23ca;
  auVar70._14_2_ = uStack_23da;
  auVar69._8_8_ = CONCAT44(iVar264,iVar264);
  auVar69._0_8_ = CONCAT44(iVar264,iVar264);
  auVar280 = pmaddwd(auVar70,auVar69);
  auVar68._2_2_ = local_25e8;
  auVar68._0_2_ = local_25d8;
  auVar68._4_2_ = uStack_25d6;
  auVar68._6_2_ = uStack_25e6;
  auVar68._10_2_ = uStack_25e4;
  auVar68._8_2_ = uStack_25d4;
  auVar68._12_2_ = uStack_25d2;
  auVar68._14_2_ = uStack_25e2;
  auVar67._8_8_ = CONCAT44(uVar265,uVar265);
  auVar67._0_8_ = CONCAT44(uVar265,uVar265);
  auVar282 = pmaddwd(auVar68,auVar67);
  auVar286._2_2_ = uStack_23e0;
  auVar286._0_2_ = uStack_23d0;
  auVar286._4_2_ = uStack_23ce;
  auVar286._6_2_ = uStack_23de;
  auVar286._10_2_ = uStack_23dc;
  auVar286._8_2_ = uStack_23cc;
  auVar286._12_2_ = uStack_23ca;
  auVar286._14_2_ = uStack_23da;
  auVar285._8_8_ = CONCAT44(uVar265,uVar265);
  auVar285._0_8_ = CONCAT44(uVar265,uVar265);
  auVar287 = pmaddwd(auVar286,auVar285);
  local_18b8 = auVar279._0_4_;
  iStack_18b4 = auVar279._4_4_;
  iStack_18b0 = auVar279._8_4_;
  iStack_18ac = auVar279._12_4_;
  local_18d8 = auVar280._0_4_;
  iStack_18d4 = auVar280._4_4_;
  iStack_18d0 = auVar280._8_4_;
  iStack_18cc = auVar280._12_4_;
  local_18f8 = auVar282._0_4_;
  iStack_18f4 = auVar282._4_4_;
  iStack_18f0 = auVar282._8_4_;
  iStack_18ec = auVar282._12_4_;
  local_1918 = auVar287._0_4_;
  iStack_1914 = auVar287._4_4_;
  iStack_1910 = auVar287._8_4_;
  iStack_190c = auVar287._12_4_;
  local_1918 = local_1918 + 0x800;
  iStack_1914 = iStack_1914 + 0x800;
  iStack_1910 = iStack_1910 + 0x800;
  iStack_190c = iStack_190c + 0x800;
  auVar282 = ZEXT416(0xc);
  iVar238 = local_18b8 + 0x800 >> auVar282;
  iVar242 = iStack_18b4 + 0x800 >> auVar282;
  auVar287 = ZEXT416(0xc);
  iVar240 = iStack_18d4 + 0x800 >> auVar287;
  iVar248 = iStack_18d0 + 0x800 >> auVar287;
  iVar254 = iStack_18cc + 0x800 >> auVar287;
  auVar288 = ZEXT416(0xc);
  auVar289 = ZEXT416(0xc);
  auVar185._4_4_ = iVar242;
  auVar185._0_4_ = iVar238;
  auVar185._12_4_ = iStack_18ac + 0x800 >> auVar282;
  auVar185._8_4_ = iStack_18b0 + 0x800 >> auVar282;
  auVar184._4_4_ = iVar240;
  auVar184._0_4_ = local_18d8 + 0x800 >> auVar287;
  auVar184._12_4_ = iVar254;
  auVar184._8_4_ = iVar248;
  auVar285 = packssdw(auVar185,auVar184);
  auVar183._4_4_ = iStack_18f4 + 0x800 >> auVar288;
  auVar183._0_4_ = local_18f8 + 0x800 >> auVar288;
  auVar183._12_4_ = iStack_18ec + 0x800 >> auVar288;
  auVar183._8_4_ = iStack_18f0 + 0x800 >> auVar288;
  auVar182._4_4_ = iStack_1914 >> auVar289;
  auVar182._0_4_ = local_1918 >> auVar289;
  auVar182._12_4_ = iStack_190c >> auVar289;
  auVar182._8_4_ = iStack_1910 >> auVar289;
  auVar286 = packssdw(auVar183,auVar182);
  paddsw(auVar271,auVar273);
  psubsw(auVar271,auVar273);
  local_2a38 = auVar277._0_8_;
  local_2a48 = auVar275._0_8_;
  piStack_2a40 = auVar275._8_8_;
  psubsw(auVar277,auVar275);
  paddsw(auVar277,auVar275);
  iStack_2a21 = auVar278[7];
  lStack_2a20 = auVar278._8_8_;
  paddsw(auVar278,auVar276);
  psubsw(auVar278,auVar276);
  psubsw(auVar272,auVar274);
  paddsw(auVar272,auVar274);
  __rounding_02[1] = auVar279._0_8_;
  __rounding_02[0] = auVar280._8_8_;
  idct32_high16_stage4_sse2
            ((__m128i *)
             CONCAT26(uStack_23da,CONCAT24(uStack_23ca,CONCAT22(uStack_23dc,uStack_23cc))),
             (int32_t *)
             CONCAT26(uStack_23de,CONCAT24(uStack_23ce,CONCAT22(uStack_23e0,uStack_23d0))),
             __rounding_02,auVar280[7]);
  cos_bit_00 = (int8_t)((uint)iVar240 >> 0x18);
  local_25f8 = (undefined2)uVar1;
  uStack_25f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_25f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_25f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_2608 = (undefined2)uVar3;
  uStack_2606 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_2604 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_2602 = (undefined2)((ulong)uVar3 >> 0x30);
  uStack_23f0 = (undefined2)uVar2;
  uStack_23ee = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_23ec = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_23ea = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_2400 = (undefined2)uVar4;
  uStack_23fe = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_23fc = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_23fa = (undefined2)((ulong)uVar4 >> 0x30);
  auVar66._2_2_ = local_2608;
  auVar66._0_2_ = local_25f8;
  auVar66._4_2_ = uStack_25f6;
  auVar66._6_2_ = uStack_2606;
  auVar66._10_2_ = uStack_2604;
  auVar66._8_2_ = uStack_25f4;
  auVar66._12_2_ = uStack_25f2;
  auVar66._14_2_ = uStack_2602;
  auVar65._8_8_ = CONCAT44(uVar266,uVar266);
  auVar65._0_8_ = CONCAT44(uVar266,uVar266);
  auVar271 = pmaddwd(auVar66,auVar65);
  auVar289._2_2_ = uStack_2400;
  auVar289._0_2_ = uStack_23f0;
  auVar289._4_2_ = uStack_23ee;
  auVar289._6_2_ = uStack_23fe;
  auVar289._10_2_ = uStack_23fc;
  auVar289._8_2_ = uStack_23ec;
  auVar289._12_2_ = uStack_23ea;
  auVar289._14_2_ = uStack_23fa;
  auVar288._8_8_ = CONCAT44(uVar266,uVar266);
  auVar288._0_8_ = CONCAT44(uVar266,uVar266);
  auVar272 = pmaddwd(auVar289,auVar288);
  auVar287._2_2_ = local_2608;
  auVar287._0_2_ = local_25f8;
  auVar287._4_2_ = uStack_25f6;
  auVar287._6_2_ = uStack_2606;
  auVar287._10_2_ = uStack_2604;
  auVar287._8_2_ = uStack_25f4;
  auVar287._12_2_ = uStack_25f2;
  auVar287._14_2_ = uStack_2602;
  auVar282._8_8_ = CONCAT44(iVar267,iVar267);
  auVar282._0_8_ = CONCAT44(iVar267,iVar267);
  auVar273 = pmaddwd(auVar287,auVar282);
  auVar280._2_2_ = uStack_2400;
  auVar280._0_2_ = uStack_23f0;
  auVar280._4_2_ = uStack_23ee;
  auVar280._6_2_ = uStack_23fe;
  auVar280._10_2_ = uStack_23fc;
  auVar280._8_2_ = uStack_23ec;
  auVar280._12_2_ = uStack_23ea;
  auVar280._14_2_ = uStack_23fa;
  auVar279._8_8_ = CONCAT44(iVar267,iVar267);
  auVar279._0_8_ = CONCAT44(iVar267,iVar267);
  auVar274 = pmaddwd(auVar280,auVar279);
  local_1938 = auVar271._0_4_;
  iStack_1934 = auVar271._4_4_;
  iStack_1930 = auVar271._8_4_;
  iStack_192c = auVar271._12_4_;
  local_1958 = auVar272._0_4_;
  iStack_1954 = auVar272._4_4_;
  iStack_1950 = auVar272._8_4_;
  iStack_194c = auVar272._12_4_;
  local_1978 = auVar273._0_4_;
  iStack_1974 = auVar273._4_4_;
  iStack_1970 = auVar273._8_4_;
  iStack_196c = auVar273._12_4_;
  local_1998 = auVar274._0_4_;
  iStack_1994 = auVar274._4_4_;
  iStack_1990 = auVar274._8_4_;
  iStack_198c = auVar274._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  iVar240 = local_1958 + 0x800 >> auVar272;
  iVar244 = iStack_1954 + 0x800 >> auVar272;
  auVar273 = ZEXT416(0xc);
  iVar250 = iStack_1970 + 0x800 >> auVar273;
  iVar256 = iStack_196c + 0x800 >> auVar273;
  auVar274 = ZEXT416(0xc);
  auVar181._4_4_ = iStack_1934 + 0x800 >> auVar271;
  auVar181._0_4_ = local_1938 + 0x800 >> auVar271;
  auVar181._12_4_ = iStack_192c + 0x800 >> auVar271;
  auVar181._8_4_ = iStack_1930 + 0x800 >> auVar271;
  auVar180._4_4_ = iVar244;
  auVar180._0_4_ = iVar240;
  auVar180._12_4_ = iStack_194c + 0x800 >> auVar272;
  auVar180._8_4_ = iStack_1950 + 0x800 >> auVar272;
  auVar279 = packssdw(auVar181,auVar180);
  auVar179._4_4_ = iStack_1974 + 0x800 >> auVar273;
  auVar179._0_4_ = local_1978 + 0x800 >> auVar273;
  auVar179._12_4_ = iVar256;
  auVar179._8_4_ = iVar250;
  auVar178._4_4_ = iStack_1994 + 0x800 >> auVar274;
  auVar178._0_4_ = local_1998 + 0x800 >> auVar274;
  auVar178._12_4_ = iStack_198c + 0x800 >> auVar274;
  auVar178._8_4_ = iStack_1990 + 0x800 >> auVar274;
  auVar280 = packssdw(auVar179,auVar178);
  local_2618 = (undefined2)uVar5;
  uStack_2616 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_2614 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_2612 = (undefined2)((ulong)uVar5 >> 0x30);
  local_2628 = (undefined2)uVar7;
  uStack_2626 = (undefined2)((ulong)uVar7 >> 0x10);
  uStack_2624 = (undefined2)((ulong)uVar7 >> 0x20);
  uStack_2622 = (undefined2)((ulong)uVar7 >> 0x30);
  uStack_2410 = (undefined2)uVar6;
  uStack_240e = (undefined2)((ulong)uVar6 >> 0x10);
  uStack_240c = (undefined2)((ulong)uVar6 >> 0x20);
  uStack_240a = (undefined2)((ulong)uVar6 >> 0x30);
  uStack_2420 = (undefined2)uVar8;
  uStack_241e = (undefined2)((ulong)uVar8 >> 0x10);
  uStack_241c = (undefined2)((ulong)uVar8 >> 0x20);
  uStack_241a = (undefined2)((ulong)uVar8 >> 0x30);
  auVar278._2_2_ = local_2628;
  auVar278._0_2_ = local_2618;
  auVar278._4_2_ = uStack_2616;
  auVar278._6_2_ = uStack_2626;
  auVar278._10_2_ = uStack_2624;
  auVar278._8_2_ = uStack_2614;
  auVar278._12_2_ = uStack_2612;
  auVar278._14_2_ = uStack_2622;
  auVar277._8_8_ = CONCAT44(iVar268,iVar268);
  auVar277._0_8_ = CONCAT44(iVar268,iVar268);
  auVar277 = pmaddwd(auVar278,auVar277);
  auVar276._2_2_ = uStack_2420;
  auVar276._0_2_ = uStack_2410;
  auVar276._4_2_ = uStack_240e;
  auVar276._6_2_ = uStack_241e;
  auVar276._10_2_ = uStack_241c;
  auVar276._8_2_ = uStack_240c;
  auVar276._12_2_ = uStack_240a;
  auVar276._14_2_ = uStack_241a;
  auVar275._8_8_ = CONCAT44(iVar268,iVar268);
  auVar275._0_8_ = CONCAT44(iVar268,iVar268);
  auVar275 = pmaddwd(auVar276,auVar275);
  auVar274._2_2_ = local_2628;
  auVar274._0_2_ = local_2618;
  auVar274._4_2_ = uStack_2616;
  auVar274._6_2_ = uStack_2626;
  auVar274._10_2_ = uStack_2624;
  auVar274._8_2_ = uStack_2614;
  auVar274._12_2_ = uStack_2612;
  auVar274._14_2_ = uStack_2622;
  auVar273._8_8_ = CONCAT44(uVar269,uVar269);
  auVar273._0_8_ = CONCAT44(uVar269,uVar269);
  auVar273 = pmaddwd(auVar274,auVar273);
  auVar272._2_2_ = uStack_2420;
  auVar272._0_2_ = uStack_2410;
  auVar272._4_2_ = uStack_240e;
  auVar272._6_2_ = uStack_241e;
  auVar272._10_2_ = uStack_241c;
  auVar272._8_2_ = uStack_240c;
  auVar272._12_2_ = uStack_240a;
  auVar272._14_2_ = uStack_241a;
  auVar271._8_8_ = CONCAT44(uVar269,uVar269);
  auVar271._0_8_ = CONCAT44(uVar269,uVar269);
  auVar271 = pmaddwd(auVar272,auVar271);
  local_19b8 = auVar277._0_4_;
  iStack_19b4 = auVar277._4_4_;
  iStack_19b0 = auVar277._8_4_;
  iStack_19ac = auVar277._12_4_;
  local_19d8 = auVar275._0_4_;
  iStack_19d4 = auVar275._4_4_;
  iStack_19d0 = auVar275._8_4_;
  iStack_19cc = auVar275._12_4_;
  local_19f8 = auVar273._0_4_;
  iStack_19f4 = auVar273._4_4_;
  iStack_19f0 = auVar273._8_4_;
  iStack_19ec = auVar273._12_4_;
  local_1a18 = auVar271._0_4_;
  iStack_1a14 = auVar271._4_4_;
  iStack_1a10 = auVar271._8_4_;
  iStack_1a0c = auVar271._12_4_;
  auVar271 = ZEXT416(0xc);
  auVar272 = ZEXT416(0xc);
  auVar273 = ZEXT416(0xc);
  auVar274 = ZEXT416(0xc);
  auVar177._4_4_ = iStack_19b4 + 0x800 >> auVar271;
  auVar177._0_4_ = local_19b8 + 0x800 >> auVar271;
  auVar177._12_4_ = iStack_19ac + 0x800 >> auVar271;
  auVar177._8_4_ = iStack_19b0 + 0x800 >> auVar271;
  auVar176._4_4_ = iStack_19d4 + 0x800 >> auVar272;
  auVar176._0_4_ = local_19d8 + 0x800 >> auVar272;
  auVar176._12_4_ = iStack_19cc + 0x800 >> auVar272;
  auVar176._8_4_ = iStack_19d0 + 0x800 >> auVar272;
  auVar271 = packssdw(auVar177,auVar176);
  auVar175._4_4_ = iStack_19f4 + 0x800 >> auVar273;
  auVar175._0_4_ = local_19f8 + 0x800 >> auVar273;
  auVar175._12_4_ = iStack_19ec + 0x800 >> auVar273;
  auVar175._8_4_ = iStack_19f0 + 0x800 >> auVar273;
  auVar174._4_4_ = iStack_1a14 + 0x800 >> auVar274;
  auVar174._0_4_ = local_1a18 + 0x800 >> auVar274;
  auVar174._12_4_ = iStack_1a0c + 0x800 >> auVar274;
  auVar174._8_4_ = iStack_1a10 + 0x800 >> auVar274;
  auVar272 = packssdw(auVar175,auVar174);
  paddsw(auVar283,auVar285);
  psubsw(auVar283,auVar285);
  paddsw(auVar284,auVar286);
  psubsw(auVar284,auVar286);
  __rounding_00[1] = local_2a48;
  __rounding_00[0] = lStack_2a20;
  idct32_high24_stage5_sse2(local_2a38,piStack_2a40,__rounding_00,iStack_2a21);
  paddsw(auVar279,auVar272);
  psubsw(auVar279,auVar272);
  paddsw(auVar280,auVar271);
  psubsw(auVar280,auVar271);
  __rounding_04[0]._4_4_ = iVar252;
  __rounding_04[0]._0_4_ = iVar246;
  __rounding_04[1]._0_4_ = local_1818;
  __rounding_04[1]._4_4_ = iStack_1814;
  idct32_high28_stage6_sse2
            ((__m128i *)CONCAT44(iStack_17ec,iStack_17f0),
             (int32_t *)CONCAT44(iStack_17f4,local_17f8),__rounding_04,cos_bit_02);
  __rounding_01[0]._4_4_ = iVar254;
  __rounding_01[0]._0_4_ = iVar248;
  __rounding_01[1]._0_4_ = iVar238;
  __rounding_01[1]._4_4_ = iVar242;
  idct32_stage7_sse2((__m128i *)CONCAT44(iStack_190c,iStack_1910),
                     (int32_t *)CONCAT44(iStack_1914,local_1918),__rounding_01,cos_bit_00);
  __rounding_03[1] = lVar291;
  __rounding_03[0] = lVar290;
  idct32_stage8_sse2(auVar281._8_8_,auVar281._0_8_,__rounding_03,cos_bit_01);
  idct32_stage9_sse2((__m128i *)CONCAT44(iVar244,iVar240),(__m128i *)CONCAT44(iVar256,iVar250));
  return;
}

Assistant:

static void idct32_sse2(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  const __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  const __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  const __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  const __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  const __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  const __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  const __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  const __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  const __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  const __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  const __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  const __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  const __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  const __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);
  const __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  const __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  const __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  const __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);

  // stage 1
  __m128i x[32];
  x[0] = input[0];
  x[1] = input[16];
  x[2] = input[8];
  x[3] = input[24];
  x[4] = input[4];
  x[5] = input[20];
  x[6] = input[12];
  x[7] = input[28];
  x[8] = input[2];
  x[9] = input[18];
  x[10] = input[10];
  x[11] = input[26];
  x[12] = input[6];
  x[13] = input[22];
  x[14] = input[14];
  x[15] = input[30];
  x[16] = input[1];
  x[17] = input[17];
  x[18] = input[9];
  x[19] = input[25];
  x[20] = input[5];
  x[21] = input[21];
  x[22] = input[13];
  x[23] = input[29];
  x[24] = input[3];
  x[25] = input[19];
  x[26] = input[11];
  x[27] = input[27];
  x[28] = input[7];
  x[29] = input[23];
  x[30] = input[15];
  x[31] = input[31];

  // stage 2
  btf_16_sse2(cospi_p62_m02, cospi_p02_p62, x[16], x[31], x[16], x[31]);
  btf_16_sse2(cospi_p30_m34, cospi_p34_p30, x[17], x[30], x[17], x[30]);
  btf_16_sse2(cospi_p46_m18, cospi_p18_p46, x[18], x[29], x[18], x[29]);
  btf_16_sse2(cospi_p14_m50, cospi_p50_p14, x[19], x[28], x[19], x[28]);
  btf_16_sse2(cospi_p54_m10, cospi_p10_p54, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_p22_m42, cospi_p42_p22, x[21], x[26], x[21], x[26]);
  btf_16_sse2(cospi_p38_m26, cospi_p26_p38, x[22], x[25], x[22], x[25]);
  btf_16_sse2(cospi_p06_m58, cospi_p58_p06, x[23], x[24], x[23], x[24]);

  // stage 3
  btf_16_sse2(cospi_p60_m04, cospi_p04_p60, x[8], x[15], x[8], x[15]);
  btf_16_sse2(cospi_p28_m36, cospi_p36_p28, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_p44_m20, cospi_p20_p44, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_p12_m52, cospi_p52_p12, x[11], x[12], x[11], x[12]);
  idct32_high16_stage3_sse2(x);

  // stage 4
  btf_16_sse2(cospi_p56_m08, cospi_p08_p56, x[4], x[7], x[4], x[7]);
  btf_16_sse2(cospi_p24_m40, cospi_p40_p24, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct32_high16_stage4_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x[0], x[1], x[0], x[1]);
  btf_16_sse2(cospi_p48_m16, cospi_p16_p48, x[2], x[3], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_adds_subs_sse2(x[7], x[6]);
  idct32_high24_stage5_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  idct32_high28_stage6_sse2(x, cospi, __rounding, cos_bit);

  // stage 7~8
  idct32_stage7_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage8_sse2(x, cospi, __rounding, cos_bit);
  idct32_stage9_sse2(output, x);
}